

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::Sigmoid_x86_avx512::forward_inplace(Sigmoid_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [56];
  undefined1 auVar70 [24];
  undefined1 auVar71 [40];
  undefined1 auVar72 [48];
  long *in_RSI;
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  double dVar76;
  float fVar77;
  float fVar78;
  __m128 _p_2;
  __m128 _zero;
  __m128 _one;
  __m256 _p_1;
  __m256 _zero_avx;
  __m256 _one_avx;
  __m512 _p;
  __m512 _zero_avx512;
  __m512 _one_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  v4sf pow2n_2;
  v4sf y_2;
  v4sf mask_2;
  v4sf one_2;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_2;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  int local_25d0;
  undefined8 local_25c0;
  undefined8 local_25b8;
  undefined8 local_25b0;
  undefined4 local_25a8;
  long local_25a0;
  undefined4 local_2598;
  undefined4 local_2594;
  undefined4 local_2590;
  undefined4 local_258c;
  undefined4 local_2588;
  undefined8 local_2580;
  undefined1 (*local_2578) [64];
  int local_256c;
  int local_2568;
  int local_2564;
  int local_2560;
  int local_255c;
  int local_2558;
  int local_2554;
  long *local_2548;
  undefined1 local_2535;
  int local_2534;
  undefined8 *local_2528;
  undefined8 *local_2520;
  undefined8 *local_2510;
  undefined1 local_2500 [64];
  undefined4 local_2484;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 uStack_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined1 (*local_2408) [64];
  undefined1 local_2400 [64];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 uStack_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [64];
  undefined1 local_22c0 [8];
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  ushort local_2242;
  float local_2240 [2];
  float afStack_2238 [2];
  float afStack_2230 [2];
  float afStack_2228 [2];
  float afStack_2220 [2];
  float afStack_2218 [2];
  float afStack_2210 [2];
  float afStack_2208 [2];
  undefined1 local_2200 [64];
  undefined1 local_21c0 [16];
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined1 local_2180 [64];
  undefined1 local_2140 [64];
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  float local_20c0 [2];
  float afStack_20b8 [2];
  float afStack_20b0 [2];
  float afStack_20a8 [2];
  float afStack_20a0 [2];
  float afStack_2098 [2];
  float afStack_2090 [2];
  float afStack_2088 [2];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined1 (*local_1f70) [64];
  undefined4 local_1f64;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined1 (*local_1f28) [64];
  float local_1f20;
  float fStack_1f1c;
  float fStack_1f18;
  float fStack_1f14;
  float fStack_1f10;
  float fStack_1f0c;
  float fStack_1f08;
  float fStack_1f04;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined1 local_1e80 [8];
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined4 local_1e40;
  undefined4 uStack_1e3c;
  undefined4 uStack_1e38;
  undefined4 uStack_1e34;
  undefined4 uStack_1e30;
  undefined4 uStack_1e2c;
  undefined4 uStack_1e28;
  undefined4 uStack_1e24;
  undefined1 local_1e20 [32];
  undefined1 local_1e00 [32];
  undefined1 local_1de0 [8];
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined1 local_1dc0 [32];
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined1 (*local_1c88) [64];
  undefined4 local_1c80;
  undefined4 uStack_1c7c;
  undefined4 uStack_1c78;
  undefined4 uStack_1c74;
  undefined4 local_1c64;
  undefined1 local_1c60 [16];
  undefined1 (*local_1c48) [64];
  float local_1c40;
  float fStack_1c3c;
  float fStack_1c38;
  float fStack_1c34;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined1 local_1bf0 [8];
  undefined8 uStack_1be8;
  undefined1 local_1be0 [16];
  undefined4 local_1bd0;
  undefined4 uStack_1bcc;
  undefined4 uStack_1bc8;
  undefined4 uStack_1bc4;
  undefined1 local_1bc0 [16];
  undefined1 local_1bb0 [8];
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined1 local_1b90 [16];
  undefined1 local_1b80 [16];
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined4 local_1b50;
  undefined4 uStack_1b4c;
  undefined4 uStack_1b48;
  undefined4 uStack_1b44;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined1 (*local_1ad8) [64];
  long local_1ad0;
  undefined4 local_1ac4;
  long local_1ac0;
  undefined1 (*local_1ab8) [64];
  undefined4 local_1aac;
  int local_1aa8;
  int local_1aa4;
  undefined8 *local_1aa0;
  undefined4 local_1a94;
  long local_1a90;
  undefined8 *local_1a70;
  float local_1a40 [2];
  float afStack_1a38 [2];
  float afStack_1a30 [2];
  float afStack_1a28 [2];
  float afStack_1a20 [2];
  float afStack_1a18 [2];
  float afStack_1a10 [2];
  float afStack_1a08 [2];
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0 [2];
  float afStack_19b8 [2];
  float afStack_19b0 [2];
  float afStack_19a8 [2];
  float afStack_19a0 [2];
  float afStack_1998 [2];
  float afStack_1990 [2];
  float afStack_1988 [2];
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 uStack_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  float local_1880 [2];
  float afStack_1878 [2];
  float afStack_1870 [2];
  float afStack_1868 [2];
  float afStack_1860 [2];
  float afStack_1858 [2];
  float afStack_1850 [2];
  float afStack_1848 [2];
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 uStack_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 uStack_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  float local_17c0 [2];
  float afStack_17b8 [2];
  float afStack_17b0 [2];
  float afStack_17a8 [2];
  float afStack_17a0 [2];
  float afStack_1798 [2];
  float afStack_1790 [2];
  float afStack_1788 [2];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  float local_1700 [2];
  float afStack_16f8 [2];
  float afStack_16f0 [2];
  float afStack_16e8 [2];
  float afStack_16e0 [2];
  float afStack_16d8 [2];
  float afStack_16d0 [2];
  float afStack_16c8 [2];
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  float local_1640 [2];
  float afStack_1638 [2];
  float afStack_1630 [2];
  float afStack_1628 [2];
  float afStack_1620 [2];
  float afStack_1618 [2];
  float afStack_1610 [2];
  float afStack_1608 [2];
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  float local_1580 [2];
  float afStack_1578 [2];
  float afStack_1570 [2];
  float afStack_1568 [2];
  float afStack_1560 [2];
  float afStack_1558 [2];
  float afStack_1550 [2];
  float afStack_1548 [2];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  float local_1500 [2];
  float afStack_14f8 [2];
  float afStack_14f0 [2];
  float afStack_14e8 [2];
  float afStack_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  float local_14c0 [2];
  float afStack_14b8 [2];
  float afStack_14b0 [2];
  float afStack_14a8 [2];
  float afStack_14a0 [2];
  float afStack_1498 [2];
  float afStack_1490 [2];
  float afStack_1488 [2];
  float local_1480 [2];
  float afStack_1478 [2];
  float afStack_1470 [2];
  float afStack_1468 [2];
  float afStack_1460 [2];
  float afStack_1458 [2];
  float afStack_1450 [2];
  float afStack_1448 [2];
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  float local_1400 [2];
  float afStack_13f8 [2];
  float afStack_13f0 [2];
  float afStack_13e8 [2];
  float afStack_13e0 [2];
  float afStack_13d8 [2];
  float afStack_13d0 [2];
  float afStack_13c8 [2];
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  ushort local_1342;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  float local_1300 [2];
  float afStack_12f8 [2];
  float afStack_12f0 [2];
  float afStack_12e8 [2];
  float afStack_12e0 [2];
  float afStack_12d8 [2];
  float afStack_12d0 [2];
  float afStack_12c8 [2];
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  float afStack_1220 [2];
  float afStack_1218 [2];
  float afStack_1210 [2];
  float afStack_1208 [2];
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  float afStack_1160 [2];
  float afStack_1158 [2];
  float afStack_1150 [2];
  float afStack_1148 [2];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined1 local_10c0 [64];
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined4 local_f04;
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [16];
  undefined1 auStack_e30 [16];
  undefined4 local_e20;
  undefined4 local_e1c;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_e00;
  undefined4 uStack_dfc;
  undefined4 uStack_df8;
  undefined4 uStack_df4;
  undefined4 uStack_df0;
  undefined4 uStack_dec;
  undefined4 uStack_de8;
  undefined4 uStack_de4;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined4 local_dc0;
  undefined4 uStack_dbc;
  undefined4 uStack_db8;
  undefined4 uStack_db4;
  undefined4 uStack_db0;
  undefined4 uStack_dac;
  undefined4 uStack_da8;
  undefined4 uStack_da4;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined4 local_d20;
  undefined4 uStack_d1c;
  undefined4 uStack_d18;
  undefined4 uStack_d14;
  undefined4 uStack_d10;
  undefined4 uStack_d0c;
  undefined4 uStack_d08;
  undefined4 uStack_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined4 local_cc0;
  undefined4 uStack_cbc;
  undefined4 uStack_cb8;
  undefined4 uStack_cb4;
  undefined4 uStack_cb0;
  undefined4 uStack_cac;
  undefined4 uStack_ca8;
  undefined4 uStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined4 local_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined4 uStack_c50;
  undefined4 uStack_c4c;
  undefined4 uStack_c48;
  undefined4 uStack_c44;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined4 local_c00;
  undefined4 uStack_bfc;
  undefined4 uStack_bf8;
  undefined4 uStack_bf4;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 uStack_be8;
  undefined4 uStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined4 local_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b98;
  undefined4 uStack_b94;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b88;
  undefined4 uStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined4 local_b40;
  undefined4 uStack_b3c;
  undefined4 uStack_b38;
  undefined4 uStack_b34;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b28;
  undefined4 uStack_b24;
  undefined4 local_b20;
  undefined4 uStack_b1c;
  undefined4 uStack_b18;
  undefined4 uStack_b14;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined4 local_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 uStack_a68;
  undefined4 uStack_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined4 local_a20;
  undefined4 uStack_a1c;
  undefined4 uStack_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a08;
  undefined4 uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined4 local_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined4 local_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined1 local_460 [16];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined4 local_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined4 local_360;
  undefined4 uStack_35c;
  undefined4 uStack_358;
  undefined4 uStack_354;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined4 local_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  
  local_2554 = *(int *)((long)in_RSI + 0x2c);
  local_2558 = (int)in_RSI[6];
  local_255c = *(int *)((long)in_RSI + 0x34);
  local_2560 = (int)in_RSI[7];
  local_2564 = (int)in_RSI[3];
  local_2568 = local_2554 * local_2558 * local_255c * local_2564;
  local_2548 = in_RSI;
  for (local_256c = 0; local_256c < local_2560; local_256c = local_256c + 1) {
    local_2528 = &local_25c0;
    local_1aa4 = *(int *)((long)local_2548 + 0x2c);
    local_1aa8 = (int)local_2548[6];
    local_1aac = *(undefined4 *)((long)local_2548 + 0x34);
    local_1ab8 = (undefined1 (*) [64])
                 (*local_2548 + local_2548[8] * (long)local_256c * local_2548[2]);
    local_1ac0 = local_2548[2];
    local_1ac4 = (undefined4)local_2548[3];
    local_1ad0 = local_2548[4];
    local_1aa0 = &local_25c0;
    local_1a90 = (long)local_1aa4 * (long)local_1aa8 * local_1ac0;
    local_2520 = &local_25c0;
    local_2510 = &local_25c0;
    local_1a94 = 0x10;
    local_2534 = local_256c;
    local_2535 = 1;
    local_25c0 = 0;
    local_25b0 = 0;
    local_25a8 = 0;
    local_2598 = 0;
    local_2594 = 0;
    local_2590 = 0;
    local_258c = 0;
    local_2588 = 0;
    local_2580 = 0;
    local_25b8 = 0;
    local_25d0 = 0;
    local_2484 = 0x3f800000;
    local_2500 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_2480 = 0;
    uStack_2478 = 0;
    uStack_2470 = 0;
    uStack_2468 = 0;
    uStack_2460 = 0;
    uStack_2458 = 0;
    uStack_2450 = 0;
    uStack_2448 = 0;
    local_2578 = local_1ab8;
    for (; local_25d0 + 0xf < local_2568; local_25d0 = local_25d0 + 0x10) {
      local_2408 = local_2578;
      auVar69 = *(undefined1 (*) [56])*local_2578;
      uStack_2008 = *(undefined8 *)(*local_2578 + 0x38);
      local_23c0 = local_2500._0_8_;
      uStack_23b8 = local_2500._8_8_;
      uStack_23b0 = local_2500._16_8_;
      uStack_23a8 = local_2500._24_8_;
      uStack_23a0 = local_2500._32_8_;
      uStack_2398 = local_2500._40_8_;
      uStack_2390 = local_2500._48_8_;
      uStack_2388 = local_2500._56_8_;
      local_2000 = 0;
      uStack_1ff8 = 0;
      uStack_1ff0 = 0;
      uStack_1fe8 = 0;
      uStack_1fe0 = 0;
      uStack_1fd8 = 0;
      uStack_1fd0 = 0;
      uStack_1fc8 = 0;
      local_26c0 = auVar69._0_8_;
      local_2040 = local_26c0;
      uStack_26b8 = auVar69._8_8_;
      uStack_2038 = uStack_26b8;
      uStack_26b0 = auVar69._16_8_;
      uStack_2030 = uStack_26b0;
      uStack_26a8 = auVar69._24_8_;
      uStack_2028 = uStack_26a8;
      uStack_26a0 = auVar69._32_8_;
      uStack_2020 = uStack_26a0;
      uStack_2698 = auVar69._40_8_;
      uStack_2018 = uStack_2698;
      uStack_2690 = auVar69._48_8_;
      uStack_2010 = uStack_2690;
      auVar73 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),*local_2578);
      local_2100 = 0;
      uStack_20f8 = 0;
      uStack_20f0 = 0;
      uStack_20e8 = 0;
      uStack_20e0 = 0;
      uStack_20d8 = 0;
      uStack_20d0 = 0;
      uStack_20c8 = 0;
      local_2240[0] = 1.0;
      local_2240[1] = 1.0;
      afStack_2238[0] = 1.0;
      afStack_2238[1] = 1.0;
      afStack_2230[0] = 1.0;
      afStack_2230[1] = 1.0;
      afStack_2228[0] = 1.0;
      afStack_2228[1] = 1.0;
      afStack_2220[0] = 1.0;
      afStack_2220[1] = 1.0;
      afStack_2218[0] = 1.0;
      afStack_2218[1] = 1.0;
      afStack_2210[0] = 1.0;
      afStack_2210[1] = 1.0;
      afStack_2208[0] = 1.0;
      afStack_2208[1] = 1.0;
      local_2140._0_8_ = auVar73._0_8_;
      local_1a00 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_19f8 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_19f0 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_19e8 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_19e0 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_19d8 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_19d0 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_19c8 = local_2140._56_8_;
      local_1a40[0] = 88.37626;
      local_1a40[1] = 88.37626;
      afStack_1a38[0] = 88.37626;
      afStack_1a38[1] = 88.37626;
      afStack_1a30[0] = 88.37626;
      afStack_1a30[1] = 88.37626;
      afStack_1a28[0] = 88.37626;
      afStack_1a28[1] = 88.37626;
      afStack_1a20[0] = 88.37626;
      afStack_1a20[1] = 88.37626;
      afStack_1a18[0] = 88.37626;
      afStack_1a18[1] = 88.37626;
      afStack_1a10[0] = 88.37626;
      afStack_1a10[1] = 88.37626;
      afStack_1a08[0] = 88.37626;
      afStack_1a08[1] = 88.37626;
      auVar74._8_4_ = 88.37626;
      auVar74._12_4_ = 88.37626;
      auVar74._0_4_ = 88.37626;
      auVar74._4_4_ = 88.37626;
      auVar74._16_4_ = 88.37626;
      auVar74._20_4_ = 88.37626;
      auVar74._24_4_ = 88.37626;
      auVar74._28_4_ = 88.37626;
      auVar74._32_4_ = 88.37626;
      auVar74._36_4_ = 88.37626;
      auVar74._40_4_ = 88.37626;
      auVar74._44_4_ = 88.37626;
      auVar74._48_4_ = 88.37626;
      auVar74._52_4_ = 88.37626;
      auVar74._56_4_ = 88.37626;
      auVar74._60_4_ = 88.37626;
      auVar73 = vminps_avx512f(auVar73,auVar74);
      local_2140._0_8_ = auVar73._0_8_;
      local_1980 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1978 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1970 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1968 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1960 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1958 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1950 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_1948 = local_2140._56_8_;
      local_19c0[0] = -88.37626;
      local_19c0[1] = -88.37626;
      afStack_19b8[0] = -88.37626;
      afStack_19b8[1] = -88.37626;
      afStack_19b0[0] = -88.37626;
      afStack_19b0[1] = -88.37626;
      afStack_19a8[0] = -88.37626;
      afStack_19a8[1] = -88.37626;
      afStack_19a0[0] = -88.37626;
      afStack_19a0[1] = -88.37626;
      afStack_1998[0] = -88.37626;
      afStack_1998[1] = -88.37626;
      afStack_1990[0] = -88.37626;
      afStack_1990[1] = -88.37626;
      afStack_1988[0] = -88.37626;
      afStack_1988[1] = -88.37626;
      auVar75._8_4_ = -88.37626;
      auVar75._12_4_ = -88.37626;
      auVar75._0_4_ = -88.37626;
      auVar75._4_4_ = -88.37626;
      auVar75._16_4_ = -88.37626;
      auVar75._20_4_ = -88.37626;
      auVar75._24_4_ = -88.37626;
      auVar75._28_4_ = -88.37626;
      auVar75._32_4_ = -88.37626;
      auVar75._36_4_ = -88.37626;
      auVar75._40_4_ = -88.37626;
      auVar75._44_4_ = -88.37626;
      auVar75._48_4_ = -88.37626;
      auVar75._52_4_ = -88.37626;
      auVar75._56_4_ = -88.37626;
      auVar75._60_4_ = -88.37626;
      auVar73 = vmaxps_avx512f(auVar73,auVar75);
      local_2140._0_8_ = auVar73._0_8_;
      local_1440 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1438 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1430 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1428 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1420 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1418 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1410 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_1408 = local_2140._56_8_;
      local_1480[0] = 1.442695;
      local_1480[1] = 1.442695;
      afStack_1478[0] = 1.442695;
      afStack_1478[1] = 1.442695;
      afStack_1470[0] = 1.442695;
      afStack_1470[1] = 1.442695;
      afStack_1468[0] = 1.442695;
      afStack_1468[1] = 1.442695;
      afStack_1460[0] = 1.442695;
      afStack_1460[1] = 1.442695;
      afStack_1458[0] = 1.442695;
      afStack_1458[1] = 1.442695;
      afStack_1450[0] = 1.442695;
      afStack_1450[1] = 1.442695;
      afStack_1448[0] = 1.442695;
      afStack_1448[1] = 1.442695;
      local_14c0[0] = 0.5;
      local_14c0[1] = 0.5;
      afStack_14b8[0] = 0.5;
      afStack_14b8[1] = 0.5;
      afStack_14b0[0] = 0.5;
      afStack_14b0[1] = 0.5;
      afStack_14a8[0] = 0.5;
      afStack_14a8[1] = 0.5;
      afStack_14a0[0] = 0.5;
      afStack_14a0[1] = 0.5;
      afStack_1498[0] = 0.5;
      afStack_1498[1] = 0.5;
      afStack_1490[0] = 0.5;
      afStack_1490[1] = 0.5;
      afStack_1488[0] = 0.5;
      afStack_1488[1] = 0.5;
      auVar33._8_4_ = 1.442695;
      auVar33._12_4_ = 1.442695;
      auVar33._0_4_ = 1.442695;
      auVar33._4_4_ = 1.442695;
      auVar33._16_4_ = 1.442695;
      auVar33._20_4_ = 1.442695;
      auVar33._24_4_ = 1.442695;
      auVar33._28_4_ = 1.442695;
      auVar33._32_4_ = 1.442695;
      auVar33._36_4_ = 1.442695;
      auVar33._40_4_ = 1.442695;
      auVar33._44_4_ = 1.442695;
      auVar33._48_4_ = 1.442695;
      auVar33._52_4_ = 1.442695;
      auVar33._56_4_ = 1.442695;
      auVar33._60_4_ = 1.442695;
      auVar32._8_4_ = 0.5;
      auVar32._12_4_ = 0.5;
      auVar32._0_4_ = 0.5;
      auVar32._4_4_ = 0.5;
      auVar32._16_4_ = 0.5;
      auVar32._20_4_ = 0.5;
      auVar32._24_4_ = 0.5;
      auVar32._28_4_ = 0.5;
      auVar32._32_4_ = 0.5;
      auVar32._36_4_ = 0.5;
      auVar32._40_4_ = 0.5;
      auVar32._44_4_ = 0.5;
      auVar32._48_4_ = 0.5;
      auVar32._52_4_ = 0.5;
      auVar32._56_4_ = 0.5;
      auVar32._60_4_ = 0.5;
      auVar74 = vfmadd213ps_avx512f(auVar33,auVar73,auVar32);
      auVar75 = vrndscaleps_avx512f(auVar74,1);
      uVar21 = vcmpps_avx512f(auVar74,auVar75,1);
      local_2242 = (ushort)uVar21;
      local_2180._0_8_ = auVar75._0_8_;
      local_13c0 = local_2180._0_8_;
      local_2180._8_8_ = auVar75._8_8_;
      uStack_13b8 = local_2180._8_8_;
      local_2180._16_8_ = auVar75._16_8_;
      uStack_13b0 = local_2180._16_8_;
      local_2180._24_8_ = auVar75._24_8_;
      uStack_13a8 = local_2180._24_8_;
      local_2180._32_8_ = auVar75._32_8_;
      uStack_13a0 = local_2180._32_8_;
      local_2180._40_8_ = auVar75._40_8_;
      uStack_1398 = local_2180._40_8_;
      local_2180._48_8_ = auVar75._48_8_;
      uStack_1390 = local_2180._48_8_;
      local_2180._56_8_ = auVar75._56_8_;
      uStack_1388 = local_2180._56_8_;
      local_1400[0] = 1.0;
      local_1400[1] = 1.0;
      afStack_13f8[0] = 1.0;
      afStack_13f8[1] = 1.0;
      afStack_13f0[0] = 1.0;
      afStack_13f0[1] = 1.0;
      afStack_13e8[0] = 1.0;
      afStack_13e8[1] = 1.0;
      afStack_13e0[0] = 1.0;
      afStack_13e0[1] = 1.0;
      afStack_13d8[0] = 1.0;
      afStack_13d8[1] = 1.0;
      afStack_13d0[0] = 1.0;
      afStack_13d0[1] = 1.0;
      afStack_13c8[0] = 1.0;
      afStack_13c8[1] = 1.0;
      local_12c0 = local_2180._0_8_;
      uStack_12b8 = local_2180._8_8_;
      uStack_12b0 = local_2180._16_8_;
      uStack_12a8 = local_2180._24_8_;
      uStack_12a0 = local_2180._32_8_;
      uStack_1298 = local_2180._40_8_;
      uStack_1290 = local_2180._48_8_;
      uStack_1288 = local_2180._56_8_;
      local_1300[0] = 1.0;
      local_1300[1] = 1.0;
      afStack_12f8[0] = 1.0;
      afStack_12f8[1] = 1.0;
      afStack_12f0[0] = 1.0;
      afStack_12f0[1] = 1.0;
      afStack_12e8[0] = 1.0;
      afStack_12e8[1] = 1.0;
      afStack_12e0[0] = 1.0;
      afStack_12e0[1] = 1.0;
      afStack_12d8[0] = 1.0;
      afStack_12d8[1] = 1.0;
      afStack_12d0[0] = 1.0;
      afStack_12d0[1] = 1.0;
      afStack_12c8[0] = 1.0;
      afStack_12c8[1] = 1.0;
      auVar34._8_4_ = 1.0;
      auVar34._12_4_ = 1.0;
      auVar34._0_4_ = 1.0;
      auVar34._4_4_ = 1.0;
      auVar34._16_4_ = 1.0;
      auVar34._20_4_ = 1.0;
      auVar34._24_4_ = 1.0;
      auVar34._28_4_ = 1.0;
      auVar34._32_4_ = 1.0;
      auVar34._36_4_ = 1.0;
      auVar34._40_4_ = 1.0;
      auVar34._44_4_ = 1.0;
      auVar34._48_4_ = 1.0;
      auVar34._52_4_ = 1.0;
      auVar34._56_4_ = 1.0;
      auVar34._60_4_ = 1.0;
      local_1340._0_4_ = auVar75._0_4_;
      local_1340._4_4_ = auVar75._4_4_;
      uStack_1338._0_4_ = auVar75._8_4_;
      uStack_1338._4_4_ = auVar75._12_4_;
      uStack_1330._0_4_ = auVar75._16_4_;
      uStack_1330._4_4_ = auVar75._20_4_;
      uStack_1328._0_4_ = auVar75._24_4_;
      uStack_1328._4_4_ = auVar75._28_4_;
      uStack_1320._0_4_ = auVar75._32_4_;
      uStack_1320._4_4_ = auVar75._36_4_;
      uStack_1318._0_4_ = auVar75._40_4_;
      uStack_1318._4_4_ = auVar75._44_4_;
      uStack_1310._0_4_ = auVar75._48_4_;
      uStack_1310._4_4_ = auVar75._52_4_;
      uStack_1308._0_4_ = auVar75._56_4_;
      uStack_1308._4_4_ = auVar75._60_4_;
      auVar74 = vsubps_avx512f(auVar75,auVar34);
      bVar1 = (bool)((byte)uVar21 & 1);
      bVar2 = (bool)((byte)(local_2242 >> 1) & 1);
      bVar3 = (bool)((byte)(local_2242 >> 2) & 1);
      bVar4 = (bool)((byte)(local_2242 >> 3) & 1);
      bVar5 = (bool)((byte)(local_2242 >> 4) & 1);
      bVar6 = (bool)((byte)(local_2242 >> 5) & 1);
      bVar7 = (bool)((byte)(local_2242 >> 6) & 1);
      bVar8 = (bool)((byte)(local_2242 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar21 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_21c0._4_4_ = (uint)bVar2 * auVar74._4_4_ | (uint)!bVar2 * local_1340._4_4_;
      local_21c0._0_4_ = (uint)bVar1 * auVar74._0_4_ | (uint)!bVar1 * (int)local_1340;
      local_21c0._8_4_ = (uint)bVar3 * auVar74._8_4_ | (uint)!bVar3 * (int)uStack_1338;
      local_21c0._12_4_ = (uint)bVar4 * auVar74._12_4_ | (uint)!bVar4 * uStack_1338._4_4_;
      uStack_21b0._0_4_ = (uint)bVar5 * auVar74._16_4_ | (uint)!bVar5 * (int)uStack_1330;
      uStack_21b0._4_4_ = (uint)bVar6 * auVar74._20_4_ | (uint)!bVar6 * uStack_1330._4_4_;
      auVar70 = _local_21c0;
      uStack_21a8._0_4_ = (uint)bVar7 * auVar74._24_4_ | (uint)!bVar7 * (int)uStack_1328;
      uStack_21a8._4_4_ = (uint)bVar8 * auVar74._28_4_ | (uint)!bVar8 * uStack_1328._4_4_;
      auVar20 = _local_21c0;
      uStack_21a0._0_4_ =
           (uint)(bVar9 & 1) * auVar74._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_1320;
      uStack_21a0._4_4_ = (uint)bVar10 * auVar74._36_4_ | (uint)!bVar10 * uStack_1320._4_4_;
      auVar71 = _local_21c0;
      uStack_2198._0_4_ = (uint)bVar11 * auVar74._40_4_ | (uint)!bVar11 * (int)uStack_1318;
      uStack_2198._4_4_ = (uint)bVar12 * auVar74._44_4_ | (uint)!bVar12 * uStack_1318._4_4_;
      auVar72 = _local_21c0;
      uStack_2190._0_4_ = (uint)bVar13 * auVar74._48_4_ | (uint)!bVar13 * (int)uStack_1310;
      uStack_2190._4_4_ = (uint)bVar14 * auVar74._52_4_ | (uint)!bVar14 * uStack_1310._4_4_;
      auVar69 = _local_21c0;
      uStack_2188._0_4_ = (uint)bVar15 * auVar74._56_4_ | (uint)!bVar15 * (int)uStack_1308;
      uStack_2188._4_4_ =
           (uint)(bVar9 >> 7) * auVar74._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_1308._4_4_;
      auVar74 = _local_21c0;
      local_1140 = local_21c0._0_8_;
      uStack_1138 = local_21c0._8_8_;
      uStack_21b0 = auVar70._16_8_;
      uStack_1130 = uStack_21b0;
      uStack_21a8 = auVar20._24_8_;
      uStack_1128 = uStack_21a8;
      uStack_21a0 = auVar71._32_8_;
      uStack_1120 = uStack_21a0;
      uStack_2198 = auVar72._40_8_;
      uStack_1118 = uStack_2198;
      uStack_2190 = auVar69._48_8_;
      uStack_1110 = uStack_2190;
      uStack_2188 = auVar74._56_8_;
      uStack_1108 = uStack_2188;
      local_1180[0] = 0.6933594;
      local_1180[1] = 0.6933594;
      afStack_1178[0] = 0.6933594;
      afStack_1178[1] = 0.6933594;
      afStack_1170[0] = 0.6933594;
      afStack_1170[1] = 0.6933594;
      afStack_1168[0] = 0.6933594;
      afStack_1168[1] = 0.6933594;
      afStack_1160[0] = 0.6933594;
      afStack_1160[1] = 0.6933594;
      afStack_1158[0] = 0.6933594;
      afStack_1158[1] = 0.6933594;
      afStack_1150[0] = 0.6933594;
      afStack_1150[1] = 0.6933594;
      afStack_1148[0] = 0.6933594;
      afStack_1148[1] = 0.6933594;
      local_11c0 = local_2140._0_8_;
      uStack_11b8 = local_2140._8_8_;
      uStack_11b0 = local_2140._16_8_;
      uStack_11a8 = local_2140._24_8_;
      uStack_11a0 = local_2140._32_8_;
      uStack_1198 = local_2140._40_8_;
      uStack_1190 = local_2140._48_8_;
      uStack_1188 = local_2140._56_8_;
      auVar38._16_8_ = uStack_21b0;
      auVar38._0_16_ = local_21c0;
      auVar38._24_8_ = uStack_21a8;
      auVar38._32_8_ = uStack_21a0;
      auVar38._40_8_ = uStack_2198;
      auVar38._48_8_ = uStack_2190;
      auVar38._56_8_ = uStack_2188;
      auVar37._8_4_ = 0.6933594;
      auVar37._12_4_ = 0.6933594;
      auVar37._0_4_ = 0.6933594;
      auVar37._4_4_ = 0.6933594;
      auVar37._16_4_ = 0.6933594;
      auVar37._20_4_ = 0.6933594;
      auVar37._24_4_ = 0.6933594;
      auVar37._28_4_ = 0.6933594;
      auVar37._32_4_ = 0.6933594;
      auVar37._36_4_ = 0.6933594;
      auVar37._40_4_ = 0.6933594;
      auVar37._44_4_ = 0.6933594;
      auVar37._48_4_ = 0.6933594;
      auVar37._52_4_ = 0.6933594;
      auVar37._56_4_ = 0.6933594;
      auVar37._60_4_ = 0.6933594;
      auVar73 = vfnmadd213ps_avx512f(auVar37,auVar38,auVar73);
      local_1200 = local_21c0._0_8_;
      uStack_11f8 = local_21c0._8_8_;
      uStack_11f0 = uStack_21b0;
      uStack_11e8 = uStack_21a8;
      uStack_11e0 = uStack_21a0;
      uStack_11d8 = uStack_2198;
      uStack_11d0 = uStack_2190;
      uStack_11c8 = uStack_2188;
      local_1240[0] = -0.00021219444;
      local_1240[1] = -0.00021219444;
      afStack_1238[0] = -0.00021219444;
      afStack_1238[1] = -0.00021219444;
      afStack_1230[0] = -0.00021219444;
      afStack_1230[1] = -0.00021219444;
      afStack_1228[0] = -0.00021219444;
      afStack_1228[1] = -0.00021219444;
      afStack_1220[0] = -0.00021219444;
      afStack_1220[1] = -0.00021219444;
      afStack_1218[0] = -0.00021219444;
      afStack_1218[1] = -0.00021219444;
      afStack_1210[0] = -0.00021219444;
      afStack_1210[1] = -0.00021219444;
      afStack_1208[0] = -0.00021219444;
      afStack_1208[1] = -0.00021219444;
      local_2140._0_8_ = auVar73._0_8_;
      local_1280 = local_2140._0_8_;
      local_2140._8_8_ = auVar73._8_8_;
      uStack_1278 = local_2140._8_8_;
      local_2140._16_8_ = auVar73._16_8_;
      uStack_1270 = local_2140._16_8_;
      local_2140._24_8_ = auVar73._24_8_;
      uStack_1268 = local_2140._24_8_;
      local_2140._32_8_ = auVar73._32_8_;
      uStack_1260 = local_2140._32_8_;
      local_2140._40_8_ = auVar73._40_8_;
      uStack_1258 = local_2140._40_8_;
      local_2140._48_8_ = auVar73._48_8_;
      uStack_1250 = local_2140._48_8_;
      local_2140._56_8_ = auVar73._56_8_;
      uStack_1248 = local_2140._56_8_;
      auVar36._16_8_ = uStack_21b0;
      auVar36._0_16_ = local_21c0;
      auVar36._24_8_ = uStack_21a8;
      auVar36._32_8_ = uStack_21a0;
      auVar36._40_8_ = uStack_2198;
      auVar36._48_8_ = uStack_2190;
      auVar36._56_8_ = uStack_2188;
      auVar35._8_4_ = -0.00021219444;
      auVar35._12_4_ = -0.00021219444;
      auVar35._0_4_ = -0.00021219444;
      auVar35._4_4_ = -0.00021219444;
      auVar35._16_4_ = -0.00021219444;
      auVar35._20_4_ = -0.00021219444;
      auVar35._24_4_ = -0.00021219444;
      auVar35._28_4_ = -0.00021219444;
      auVar35._32_4_ = -0.00021219444;
      auVar35._36_4_ = -0.00021219444;
      auVar35._40_4_ = -0.00021219444;
      auVar35._44_4_ = -0.00021219444;
      auVar35._48_4_ = -0.00021219444;
      auVar35._52_4_ = -0.00021219444;
      auVar35._56_4_ = -0.00021219444;
      auVar35._60_4_ = -0.00021219444;
      local_2140 = vfnmadd213ps_avx512f(auVar35,auVar36,auVar73);
      local_1080 = local_2140._0_8_;
      uStack_1078 = local_2140._8_8_;
      uStack_1070 = local_2140._16_8_;
      uStack_1068 = local_2140._24_8_;
      uStack_1060 = local_2140._32_8_;
      uStack_1058 = local_2140._40_8_;
      uStack_1050 = local_2140._48_8_;
      uStack_1048 = local_2140._56_8_;
      local_2180 = vmulps_avx512f(local_2140,local_2140);
      uStack_22b8._0_4_ = 0.00019875691;
      uStack_22b8._4_4_ = 0.00019875691;
      local_22c0._0_4_ = 0.00019875691;
      local_22c0._4_4_ = 0.00019875691;
      local_1500[0] = 0.00019875691;
      local_1500[1] = 0.00019875691;
      afStack_14f8[0] = 0.00019875691;
      afStack_14f8[1] = 0.00019875691;
      afStack_14f0[0] = 0.00019875691;
      afStack_14f0[1] = 0.00019875691;
      afStack_14e8[0] = 0.00019875691;
      afStack_14e8[1] = 0.00019875691;
      afStack_14e0[0] = 0.00019875691;
      afStack_14e0[1] = 0.00019875691;
      afStack_14d8[0] = 0.00019875691;
      afStack_14d8[1] = 0.00019875691;
      afStack_14d0[0] = 0.00019875691;
      afStack_14d0[1] = 0.00019875691;
      afStack_14c8[0] = 0.00019875691;
      afStack_14c8[1] = 0.00019875691;
      local_1540 = local_2140._0_8_;
      uStack_1538 = local_2140._8_8_;
      uStack_1530 = local_2140._16_8_;
      uStack_1528 = local_2140._24_8_;
      uStack_1520 = local_2140._32_8_;
      uStack_1518 = local_2140._40_8_;
      uStack_1510 = local_2140._48_8_;
      uStack_1508 = local_2140._56_8_;
      local_1580[0] = 0.0013981999;
      local_1580[1] = 0.0013981999;
      afStack_1578[0] = 0.0013981999;
      afStack_1578[1] = 0.0013981999;
      afStack_1570[0] = 0.0013981999;
      afStack_1570[1] = 0.0013981999;
      afStack_1568[0] = 0.0013981999;
      afStack_1568[1] = 0.0013981999;
      afStack_1560[0] = 0.0013981999;
      afStack_1560[1] = 0.0013981999;
      afStack_1558[0] = 0.0013981999;
      afStack_1558[1] = 0.0013981999;
      afStack_1550[0] = 0.0013981999;
      afStack_1550[1] = 0.0013981999;
      afStack_1548[0] = 0.0013981999;
      afStack_1548[1] = 0.0013981999;
      auVar31._16_4_ = 0.00019875691;
      auVar31._20_4_ = 0.00019875691;
      auVar31._0_16_ = _local_22c0;
      auVar31._24_4_ = 0.00019875691;
      auVar31._28_4_ = 0.00019875691;
      auVar31._32_4_ = 0.00019875691;
      auVar31._36_4_ = 0.00019875691;
      auVar31._40_4_ = 0.00019875691;
      auVar31._44_4_ = 0.00019875691;
      auVar31._48_4_ = 0.00019875691;
      auVar31._52_4_ = 0.00019875691;
      auVar31._56_4_ = 0.00019875691;
      auVar31._60_4_ = 0.00019875691;
      auVar30._8_4_ = 0.0013981999;
      auVar30._12_4_ = 0.0013981999;
      auVar30._0_4_ = 0.0013981999;
      auVar30._4_4_ = 0.0013981999;
      auVar30._16_4_ = 0.0013981999;
      auVar30._20_4_ = 0.0013981999;
      auVar30._24_4_ = 0.0013981999;
      auVar30._28_4_ = 0.0013981999;
      auVar30._32_4_ = 0.0013981999;
      auVar30._36_4_ = 0.0013981999;
      auVar30._40_4_ = 0.0013981999;
      auVar30._44_4_ = 0.0013981999;
      auVar30._48_4_ = 0.0013981999;
      auVar30._52_4_ = 0.0013981999;
      auVar30._56_4_ = 0.0013981999;
      auVar30._60_4_ = 0.0013981999;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar31,auVar30);
      local_22c0 = auVar73._0_8_;
      local_15c0 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_15b8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_15b0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_15a8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_15a0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1598 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1590 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1588 = uStack_2288;
      local_1600 = local_2140._0_8_;
      uStack_15f8 = local_2140._8_8_;
      uStack_15f0 = local_2140._16_8_;
      uStack_15e8 = local_2140._24_8_;
      uStack_15e0 = local_2140._32_8_;
      uStack_15d8 = local_2140._40_8_;
      uStack_15d0 = local_2140._48_8_;
      uStack_15c8 = local_2140._56_8_;
      local_1640[0] = 0.008333452;
      local_1640[1] = 0.008333452;
      afStack_1638[0] = 0.008333452;
      afStack_1638[1] = 0.008333452;
      afStack_1630[0] = 0.008333452;
      afStack_1630[1] = 0.008333452;
      afStack_1628[0] = 0.008333452;
      afStack_1628[1] = 0.008333452;
      afStack_1620[0] = 0.008333452;
      afStack_1620[1] = 0.008333452;
      afStack_1618[0] = 0.008333452;
      afStack_1618[1] = 0.008333452;
      afStack_1610[0] = 0.008333452;
      afStack_1610[1] = 0.008333452;
      afStack_1608[0] = 0.008333452;
      afStack_1608[1] = 0.008333452;
      auVar29._8_4_ = 0.008333452;
      auVar29._12_4_ = 0.008333452;
      auVar29._0_4_ = 0.008333452;
      auVar29._4_4_ = 0.008333452;
      auVar29._16_4_ = 0.008333452;
      auVar29._20_4_ = 0.008333452;
      auVar29._24_4_ = 0.008333452;
      auVar29._28_4_ = 0.008333452;
      auVar29._32_4_ = 0.008333452;
      auVar29._36_4_ = 0.008333452;
      auVar29._40_4_ = 0.008333452;
      auVar29._44_4_ = 0.008333452;
      auVar29._48_4_ = 0.008333452;
      auVar29._52_4_ = 0.008333452;
      auVar29._56_4_ = 0.008333452;
      auVar29._60_4_ = 0.008333452;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar29);
      local_22c0 = auVar73._0_8_;
      local_1680 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1678 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1670 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1668 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1660 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1658 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1650 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1648 = uStack_2288;
      local_16c0 = local_2140._0_8_;
      uStack_16b8 = local_2140._8_8_;
      uStack_16b0 = local_2140._16_8_;
      uStack_16a8 = local_2140._24_8_;
      uStack_16a0 = local_2140._32_8_;
      uStack_1698 = local_2140._40_8_;
      uStack_1690 = local_2140._48_8_;
      uStack_1688 = local_2140._56_8_;
      local_1700[0] = 0.041665796;
      local_1700[1] = 0.041665796;
      afStack_16f8[0] = 0.041665796;
      afStack_16f8[1] = 0.041665796;
      afStack_16f0[0] = 0.041665796;
      afStack_16f0[1] = 0.041665796;
      afStack_16e8[0] = 0.041665796;
      afStack_16e8[1] = 0.041665796;
      afStack_16e0[0] = 0.041665796;
      afStack_16e0[1] = 0.041665796;
      afStack_16d8[0] = 0.041665796;
      afStack_16d8[1] = 0.041665796;
      afStack_16d0[0] = 0.041665796;
      afStack_16d0[1] = 0.041665796;
      afStack_16c8[0] = 0.041665796;
      afStack_16c8[1] = 0.041665796;
      auVar28._8_4_ = 0.041665796;
      auVar28._12_4_ = 0.041665796;
      auVar28._0_4_ = 0.041665796;
      auVar28._4_4_ = 0.041665796;
      auVar28._16_4_ = 0.041665796;
      auVar28._20_4_ = 0.041665796;
      auVar28._24_4_ = 0.041665796;
      auVar28._28_4_ = 0.041665796;
      auVar28._32_4_ = 0.041665796;
      auVar28._36_4_ = 0.041665796;
      auVar28._40_4_ = 0.041665796;
      auVar28._44_4_ = 0.041665796;
      auVar28._48_4_ = 0.041665796;
      auVar28._52_4_ = 0.041665796;
      auVar28._56_4_ = 0.041665796;
      auVar28._60_4_ = 0.041665796;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar28);
      local_22c0 = auVar73._0_8_;
      local_1740 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_1738 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_1730 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_1728 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_1720 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1718 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1710 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1708 = uStack_2288;
      local_1780 = local_2140._0_8_;
      uStack_1778 = local_2140._8_8_;
      uStack_1770 = local_2140._16_8_;
      uStack_1768 = local_2140._24_8_;
      uStack_1760 = local_2140._32_8_;
      uStack_1758 = local_2140._40_8_;
      uStack_1750 = local_2140._48_8_;
      uStack_1748 = local_2140._56_8_;
      local_17c0[0] = 0.16666666;
      local_17c0[1] = 0.16666666;
      afStack_17b8[0] = 0.16666666;
      afStack_17b8[1] = 0.16666666;
      afStack_17b0[0] = 0.16666666;
      afStack_17b0[1] = 0.16666666;
      afStack_17a8[0] = 0.16666666;
      afStack_17a8[1] = 0.16666666;
      afStack_17a0[0] = 0.16666666;
      afStack_17a0[1] = 0.16666666;
      afStack_1798[0] = 0.16666666;
      afStack_1798[1] = 0.16666666;
      afStack_1790[0] = 0.16666666;
      afStack_1790[1] = 0.16666666;
      afStack_1788[0] = 0.16666666;
      afStack_1788[1] = 0.16666666;
      auVar27._8_4_ = 0.16666666;
      auVar27._12_4_ = 0.16666666;
      auVar27._0_4_ = 0.16666666;
      auVar27._4_4_ = 0.16666666;
      auVar27._16_4_ = 0.16666666;
      auVar27._20_4_ = 0.16666666;
      auVar27._24_4_ = 0.16666666;
      auVar27._28_4_ = 0.16666666;
      auVar27._32_4_ = 0.16666666;
      auVar27._36_4_ = 0.16666666;
      auVar27._40_4_ = 0.16666666;
      auVar27._44_4_ = 0.16666666;
      auVar27._48_4_ = 0.16666666;
      auVar27._52_4_ = 0.16666666;
      auVar27._56_4_ = 0.16666666;
      auVar27._60_4_ = 0.16666666;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar27);
      local_22c0 = auVar73._0_8_;
      local_1800 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_17f8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_17f0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_17e8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_17e0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_17d8 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_17d0 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_17c8 = uStack_2288;
      local_1840 = local_2140._0_8_;
      uStack_1838 = local_2140._8_8_;
      uStack_1830 = local_2140._16_8_;
      uStack_1828 = local_2140._24_8_;
      uStack_1820 = local_2140._32_8_;
      uStack_1818 = local_2140._40_8_;
      uStack_1810 = local_2140._48_8_;
      uStack_1808 = local_2140._56_8_;
      local_1880[0] = 0.5;
      local_1880[1] = 0.5;
      afStack_1878[0] = 0.5;
      afStack_1878[1] = 0.5;
      afStack_1870[0] = 0.5;
      afStack_1870[1] = 0.5;
      afStack_1868[0] = 0.5;
      afStack_1868[1] = 0.5;
      afStack_1860[0] = 0.5;
      afStack_1860[1] = 0.5;
      afStack_1858[0] = 0.5;
      afStack_1858[1] = 0.5;
      afStack_1850[0] = 0.5;
      afStack_1850[1] = 0.5;
      afStack_1848[0] = 0.5;
      afStack_1848[1] = 0.5;
      auVar26._8_4_ = 0.5;
      auVar26._12_4_ = 0.5;
      auVar26._0_4_ = 0.5;
      auVar26._4_4_ = 0.5;
      auVar26._16_4_ = 0.5;
      auVar26._20_4_ = 0.5;
      auVar26._24_4_ = 0.5;
      auVar26._28_4_ = 0.5;
      auVar26._32_4_ = 0.5;
      auVar26._36_4_ = 0.5;
      auVar26._40_4_ = 0.5;
      auVar26._44_4_ = 0.5;
      auVar26._48_4_ = 0.5;
      auVar26._52_4_ = 0.5;
      auVar26._56_4_ = 0.5;
      auVar26._60_4_ = 0.5;
      auVar73 = vfmadd213ps_avx512f(local_2140,auVar73,auVar26);
      local_22c0 = auVar73._0_8_;
      local_18c0 = local_22c0;
      uStack_22b8 = auVar73._8_8_;
      uStack_18b8 = uStack_22b8;
      uStack_22b0 = auVar73._16_8_;
      uStack_18b0 = uStack_22b0;
      uStack_22a8 = auVar73._24_8_;
      uStack_18a8 = uStack_22a8;
      uStack_22a0 = auVar73._32_8_;
      uStack_18a0 = uStack_22a0;
      uStack_2298 = auVar73._40_8_;
      uStack_1898 = uStack_2298;
      uStack_2290 = auVar73._48_8_;
      uStack_1890 = uStack_2290;
      uStack_2288 = auVar73._56_8_;
      uStack_1888 = uStack_2288;
      local_1900 = local_2180._0_8_;
      uStack_18f8 = local_2180._8_8_;
      uStack_18f0 = local_2180._16_8_;
      uStack_18e8 = local_2180._24_8_;
      uStack_18e0 = local_2180._32_8_;
      uStack_18d8 = local_2180._40_8_;
      uStack_18d0 = local_2180._48_8_;
      uStack_18c8 = local_2180._56_8_;
      local_1940 = local_2140._0_8_;
      uStack_1938 = local_2140._8_8_;
      uStack_1930 = local_2140._16_8_;
      uStack_1928 = local_2140._24_8_;
      uStack_1920 = local_2140._32_8_;
      uStack_1918 = local_2140._40_8_;
      uStack_1910 = local_2140._48_8_;
      uStack_1908 = local_2140._56_8_;
      auVar75 = vfmadd213ps_avx512f(local_2180,auVar73,local_2140);
      local_22c0 = auVar75._0_8_;
      local_2080 = local_22c0;
      uStack_22b8 = auVar75._8_8_;
      uStack_2078 = uStack_22b8;
      uStack_22b0 = auVar75._16_8_;
      uStack_2070 = uStack_22b0;
      uStack_22a8 = auVar75._24_8_;
      uStack_2068 = uStack_22a8;
      uStack_22a0 = auVar75._32_8_;
      uStack_2060 = uStack_22a0;
      uStack_2298 = auVar75._40_8_;
      uStack_2058 = uStack_2298;
      uStack_2290 = auVar75._48_8_;
      uStack_2050 = uStack_2290;
      uStack_2288 = auVar75._56_8_;
      uStack_2048 = uStack_2288;
      local_20c0[0] = 1.0;
      local_20c0[1] = 1.0;
      afStack_20b8[0] = 1.0;
      afStack_20b8[1] = 1.0;
      afStack_20b0[0] = 1.0;
      afStack_20b0[1] = 1.0;
      afStack_20a8[0] = 1.0;
      afStack_20a8[1] = 1.0;
      afStack_20a0[0] = 1.0;
      afStack_20a0[1] = 1.0;
      afStack_2098[0] = 1.0;
      afStack_2098[1] = 1.0;
      afStack_2090[0] = 1.0;
      afStack_2090[1] = 1.0;
      afStack_2088[0] = 1.0;
      afStack_2088[1] = 1.0;
      auVar73._8_4_ = 1.0;
      auVar73._12_4_ = 1.0;
      auVar73._0_4_ = 1.0;
      auVar73._4_4_ = 1.0;
      auVar73._16_4_ = 1.0;
      auVar73._20_4_ = 1.0;
      auVar73._24_4_ = 1.0;
      auVar73._28_4_ = 1.0;
      auVar73._32_4_ = 1.0;
      auVar73._36_4_ = 1.0;
      auVar73._40_4_ = 1.0;
      auVar73._44_4_ = 1.0;
      auVar73._48_4_ = 1.0;
      auVar73._52_4_ = 1.0;
      auVar73._56_4_ = 1.0;
      auVar73._60_4_ = 1.0;
      local_10c0 = vaddps_avx512f(auVar75,auVar73);
      local_1000 = local_21c0._0_8_;
      uStack_ff8 = local_21c0._8_8_;
      uStack_ff0 = uStack_21b0;
      uStack_fe8 = uStack_21a8;
      uStack_fe0 = uStack_21a0;
      uStack_fd8 = uStack_2198;
      uStack_fd0 = uStack_2190;
      uStack_fc8 = uStack_2188;
      auVar39._16_8_ = uStack_21b0;
      auVar39._0_16_ = local_21c0;
      auVar39._24_8_ = uStack_21a8;
      auVar39._32_8_ = uStack_21a0;
      auVar39._40_8_ = uStack_2198;
      auVar39._48_8_ = uStack_2190;
      auVar39._56_8_ = uStack_2188;
      local_e80 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      vmovdqa64_avx512f(local_e80);
      auVar73 = vcvttps2dq_avx512f(auVar39);
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar75 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_f80 = vmovdqa64_avx512f(auVar73);
      local_fc0 = vmovdqa64_avx512f(auVar75);
      auVar73 = vmovdqa64_avx512f(local_f80);
      auVar75 = vmovdqa64_avx512f(local_fc0);
      auVar73 = vpaddd_avx512f(auVar73,auVar75);
      auVar73 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(auVar73);
      local_f00 = vmovdqa64_avx512f(auVar73);
      local_f04 = 0x17;
      auVar73 = vmovdqa64_avx512f(local_f00);
      auVar73 = vpslld_avx512f(auVar73,ZEXT416(0x17));
      local_2200 = vmovdqa64_avx512f(auVar73);
      auVar73 = vmovdqa64_avx512f(local_2200);
      local_ec0 = vmovdqa64_avx512f(auVar73);
      local_2300 = vmovdqa64_avx512f(local_ec0);
      local_1100 = local_2300._0_8_;
      uStack_10f8 = local_2300._8_8_;
      uStack_10f0 = local_2300._16_8_;
      uStack_10e8 = local_2300._24_8_;
      uStack_10e0 = local_2300._32_8_;
      uStack_10d8 = local_2300._40_8_;
      uStack_10d0 = local_2300._48_8_;
      uStack_10c8 = local_2300._56_8_;
      _local_22c0 = vmulps_avx512f(local_10c0,local_2300);
      local_2380 = local_22c0;
      uStack_2378 = uStack_22b8;
      uStack_2370 = uStack_22b0;
      uStack_2368 = uStack_22a8;
      uStack_2360 = uStack_22a0;
      uStack_2358 = uStack_2298;
      uStack_2350 = uStack_2290;
      uStack_2348 = uStack_2288;
      local_2400 = vaddps_avx512f(local_2500,_local_22c0);
      auVar73 = vdivps_avx512f(local_2500,local_2400);
      local_1f70 = local_2578;
      local_26c0 = auVar73._0_8_;
      local_1fc0 = local_26c0;
      uStack_26b8 = auVar73._8_8_;
      uStack_1fb8 = uStack_26b8;
      uStack_26b0 = auVar73._16_8_;
      uStack_1fb0 = uStack_26b0;
      uStack_26a8 = auVar73._24_8_;
      uStack_1fa8 = uStack_26a8;
      uStack_26a0 = auVar73._32_8_;
      uStack_1fa0 = uStack_26a0;
      uStack_2698 = auVar73._40_8_;
      uStack_1f98 = uStack_2698;
      uStack_2690 = auVar73._48_8_;
      uStack_1f90 = uStack_2690;
      uStack_2688 = auVar73._56_8_;
      uStack_1f88 = uStack_2688;
      *(undefined8 *)*local_2578 = local_26c0;
      *(undefined8 *)(*local_2578 + 8) = uStack_26b8;
      *(undefined8 *)(*local_2578 + 0x10) = uStack_26b0;
      *(undefined8 *)(*local_2578 + 0x18) = uStack_26a8;
      *(undefined8 *)(*local_2578 + 0x20) = uStack_26a0;
      *(undefined8 *)(*local_2578 + 0x28) = uStack_2698;
      *(undefined8 *)(*local_2578 + 0x30) = uStack_2690;
      *(undefined8 *)(*local_2578 + 0x38) = uStack_2688;
      local_2578 = local_2578 + 1;
      local_2340 = local_23c0;
      uStack_2338 = uStack_23b8;
      uStack_2330 = uStack_23b0;
      uStack_2328 = uStack_23a8;
      uStack_2320 = uStack_23a0;
      uStack_2318 = uStack_2398;
      uStack_2310 = uStack_2390;
      uStack_2308 = uStack_2388;
      _local_21c0 = auVar74;
      local_1342 = local_2242;
      local_1340 = local_13c0;
      uStack_1338 = uStack_13b8;
      uStack_1330 = uStack_13b0;
      uStack_1328 = uStack_13a8;
      uStack_1320 = uStack_13a0;
      uStack_1318 = uStack_1398;
      uStack_1310 = uStack_1390;
      uStack_1308 = uStack_1388;
      local_1040 = local_1080;
      uStack_1038 = uStack_1078;
      uStack_1030 = uStack_1070;
      uStack_1028 = uStack_1068;
      uStack_1020 = uStack_1060;
      uStack_1018 = uStack_1058;
      uStack_1010 = uStack_1050;
      uStack_1008 = uStack_1048;
    }
    local_1f64 = 0x3f800000;
    local_e04 = 0x3f800000;
    local_e08 = 0x3f800000;
    local_e0c = 0x3f800000;
    local_e10 = 0x3f800000;
    local_e14 = 0x3f800000;
    local_e18 = 0x3f800000;
    local_e1c = 0x3f800000;
    local_e20 = 0x3f800000;
    auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
    local_e40 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x20);
    auStack_e30 = vinsertps_avx(auVar16,ZEXT416(0x3f800000),0x30);
    local_1f60 = 0;
    uStack_1f58 = 0;
    uStack_1f50 = 0;
    uStack_1f48 = 0;
    for (; local_25d0 + 7 < local_2568; local_25d0 = local_25d0 + 8) {
      local_1f28 = local_2578;
      auVar70 = *(undefined1 (*) [24])*local_2578;
      uStack_1ce8 = *(undefined8 *)(*local_2578 + 0x18);
      local_1f00 = local_e40._0_8_;
      uStack_1ef8 = local_e40._8_8_;
      uStack_1ef0 = auStack_e30._0_8_;
      uStack_1ee8 = auStack_e30._8_8_;
      local_1ce0 = 0;
      uStack_1cd8 = 0;
      uStack_1cd0 = 0;
      uStack_1cc8 = 0;
      local_2720 = auVar70._0_8_;
      local_1d00 = local_2720;
      uStack_2718 = auVar70._8_8_;
      uStack_1cf8 = uStack_2718;
      uStack_2710 = auVar70._16_8_;
      uStack_1cf0 = uStack_2710;
      auVar20 = vsubps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_2578);
      local_1da0 = 0;
      uStack_1d98 = 0;
      uStack_1d90 = 0;
      uStack_1d88 = 0;
      local_1e40 = 0x3f800000;
      uStack_1e3c = 0x3f800000;
      uStack_1e38 = 0x3f800000;
      uStack_1e34 = 0x3f800000;
      uStack_1e30 = 0x3f800000;
      uStack_1e2c = 0x3f800000;
      uStack_1e28 = 0x3f800000;
      uStack_1e24 = 0x3f800000;
      local_1dc0._0_8_ = auVar20._0_8_;
      local_de0 = local_1dc0._0_8_;
      local_1dc0._8_8_ = auVar20._8_8_;
      uStack_dd8 = local_1dc0._8_8_;
      local_1dc0._16_8_ = auVar20._16_8_;
      uStack_dd0 = local_1dc0._16_8_;
      local_1dc0._24_8_ = auVar20._24_8_;
      uStack_dc8 = local_1dc0._24_8_;
      local_e00 = 0x42b0c0a5;
      uStack_dfc = 0x42b0c0a5;
      uStack_df8 = 0x42b0c0a5;
      uStack_df4 = 0x42b0c0a5;
      uStack_df0 = 0x42b0c0a5;
      uStack_dec = 0x42b0c0a5;
      uStack_de8 = 0x42b0c0a5;
      uStack_de4 = 0x42b0c0a5;
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar19._16_4_ = 0x42b0c0a5;
      auVar19._20_4_ = 0x42b0c0a5;
      auVar19._24_4_ = 0x42b0c0a5;
      auVar19._28_4_ = 0x42b0c0a5;
      auVar20 = vminps_avx(auVar20,auVar19);
      local_1dc0._0_8_ = auVar20._0_8_;
      local_da0 = local_1dc0._0_8_;
      local_1dc0._8_8_ = auVar20._8_8_;
      uStack_d98 = local_1dc0._8_8_;
      local_1dc0._16_8_ = auVar20._16_8_;
      uStack_d90 = local_1dc0._16_8_;
      local_1dc0._24_8_ = auVar20._24_8_;
      uStack_d88 = local_1dc0._24_8_;
      local_dc0 = 0xc2b0c0a5;
      uStack_dbc = 0xc2b0c0a5;
      uStack_db8 = 0xc2b0c0a5;
      uStack_db4 = 0xc2b0c0a5;
      uStack_db0 = 0xc2b0c0a5;
      uStack_dac = 0xc2b0c0a5;
      uStack_da8 = 0xc2b0c0a5;
      uStack_da4 = 0xc2b0c0a5;
      auVar40._8_4_ = 0xc2b0c0a5;
      auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar40._12_4_ = 0xc2b0c0a5;
      auVar40._16_4_ = 0xc2b0c0a5;
      auVar40._20_4_ = 0xc2b0c0a5;
      auVar40._24_4_ = 0xc2b0c0a5;
      auVar40._28_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar20,auVar40);
      local_1dc0._0_8_ = auVar18._0_8_;
      local_b00 = local_1dc0._0_8_;
      local_1dc0._8_8_ = auVar18._8_8_;
      uStack_af8 = local_1dc0._8_8_;
      local_1dc0._16_8_ = auVar18._16_8_;
      uStack_af0 = local_1dc0._16_8_;
      local_1dc0._24_8_ = auVar18._24_8_;
      uStack_ae8 = local_1dc0._24_8_;
      local_b20 = 0x3fb8aa3b;
      uStack_b1c = 0x3fb8aa3b;
      uStack_b18 = 0x3fb8aa3b;
      uStack_b14 = 0x3fb8aa3b;
      uStack_b10 = 0x3fb8aa3b;
      uStack_b0c = 0x3fb8aa3b;
      uStack_b08 = 0x3fb8aa3b;
      uStack_b04 = 0x3fb8aa3b;
      local_b40 = 0x3f000000;
      uStack_b3c = 0x3f000000;
      uStack_b38 = 0x3f000000;
      uStack_b34 = 0x3f000000;
      uStack_b30 = 0x3f000000;
      uStack_b2c = 0x3f000000;
      uStack_b28 = 0x3f000000;
      uStack_b24 = 0x3f000000;
      local_860 = local_1dc0._0_8_;
      uStack_858 = local_1dc0._8_8_;
      uStack_850 = local_1dc0._16_8_;
      uStack_848 = local_1dc0._24_8_;
      local_880 = 0x3fb8aa3b3fb8aa3b;
      uStack_878 = 0x3fb8aa3b3fb8aa3b;
      uStack_870 = 0x3fb8aa3b3fb8aa3b;
      uStack_868 = 0x3fb8aa3b3fb8aa3b;
      local_8a0 = 0x3f0000003f000000;
      uStack_898 = 0x3f0000003f000000;
      uStack_890 = 0x3f0000003f000000;
      uStack_888 = 0x3f0000003f000000;
      auVar43._8_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar43._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar43._16_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar43._24_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar42._8_8_ = 0x3f0000003f000000;
      auVar42._0_8_ = 0x3f0000003f000000;
      auVar42._16_8_ = 0x3f0000003f000000;
      auVar42._24_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(auVar43,auVar18,auVar42);
      auVar19 = vroundps_avx(ZEXT1632(auVar16),1);
      auVar20 = vcmpps_avx(ZEXT1632(auVar16),auVar19,1);
      local_1e60._0_8_ = auVar20._0_8_;
      local_ac0 = local_1e60._0_8_;
      local_1e60._8_8_ = auVar20._8_8_;
      uStack_ab8 = local_1e60._8_8_;
      local_1e60._16_8_ = auVar20._16_8_;
      uStack_ab0 = local_1e60._16_8_;
      local_1e60._24_8_ = auVar20._24_8_;
      uStack_aa8 = local_1e60._24_8_;
      local_ae0 = 0x3f8000003f800000;
      uStack_ad8 = 0x3f8000003f800000;
      uStack_ad0 = 0x3f8000003f800000;
      uStack_ac8 = 0x3f8000003f800000;
      auVar41._8_8_ = 0x3f8000003f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._16_8_ = 0x3f8000003f800000;
      auVar41._24_8_ = 0x3f8000003f800000;
      local_1e60 = vpand_avx2(auVar20,auVar41);
      local_1de0 = auVar19._0_8_;
      local_1d20 = local_1de0;
      uStack_1dd8 = auVar19._8_8_;
      uStack_1d18 = uStack_1dd8;
      uStack_1dd0 = auVar19._16_8_;
      uStack_1d10 = uStack_1dd0;
      uStack_1dc8 = auVar19._24_8_;
      uStack_1d08 = uStack_1dc8;
      local_1d40 = local_1e60._0_8_;
      uStack_1d38 = local_1e60._8_8_;
      uStack_1d30 = local_1e60._16_8_;
      uStack_1d28 = local_1e60._24_8_;
      local_1e00 = vsubps_avx(auVar19,local_1e60);
      local_a00 = local_1e00._0_8_;
      uStack_9f8 = local_1e00._8_8_;
      uStack_9f0 = local_1e00._16_8_;
      uStack_9e8 = local_1e00._24_8_;
      local_a40 = local_1dc0._0_8_;
      uStack_a38 = local_1dc0._8_8_;
      uStack_a30 = local_1dc0._16_8_;
      uStack_a28 = local_1dc0._24_8_;
      local_a20 = 0x3f318000;
      uStack_a1c = 0x3f318000;
      uStack_a18 = 0x3f318000;
      uStack_a14 = 0x3f318000;
      uStack_a10 = 0x3f318000;
      uStack_a0c = 0x3f318000;
      uStack_a08 = 0x3f318000;
      uStack_a04 = 0x3f318000;
      local_5c0 = local_1e00._0_8_;
      uStack_5b8 = local_1e00._8_8_;
      uStack_5b0 = local_1e00._16_8_;
      uStack_5a8 = local_1e00._24_8_;
      local_5e0 = 0x3f3180003f318000;
      uStack_5d8 = 0x3f3180003f318000;
      uStack_5d0 = 0x3f3180003f318000;
      uStack_5c8 = 0x3f3180003f318000;
      local_600 = local_1dc0._0_8_;
      uStack_5f8 = local_1dc0._8_8_;
      uStack_5f0 = local_1dc0._16_8_;
      uStack_5e8 = local_1dc0._24_8_;
      auVar50._8_8_ = 0x3f3180003f318000;
      auVar50._0_8_ = 0x3f3180003f318000;
      auVar50._16_8_ = 0x3f3180003f318000;
      auVar50._24_8_ = 0x3f3180003f318000;
      auVar16 = vfnmadd213ps_fma(auVar50,local_1e00,auVar18);
      local_a60 = local_1e00._0_8_;
      uStack_a58 = local_1e00._8_8_;
      uStack_a50 = local_1e00._16_8_;
      uStack_a48 = local_1e00._24_8_;
      local_1dc0._0_8_ = auVar16._0_8_;
      local_aa0 = local_1dc0._0_8_;
      local_1dc0._8_8_ = auVar16._8_8_;
      uStack_a98 = local_1dc0._8_8_;
      uStack_a90 = 0;
      uStack_a88 = 0;
      local_a80 = 0xb95e8083;
      uStack_a7c = 0xb95e8083;
      uStack_a78 = 0xb95e8083;
      uStack_a74 = 0xb95e8083;
      uStack_a70 = 0xb95e8083;
      uStack_a6c = 0xb95e8083;
      uStack_a68 = 0xb95e8083;
      uStack_a64 = 0xb95e8083;
      local_560 = local_1e00._0_8_;
      uStack_558 = local_1e00._8_8_;
      uStack_550 = local_1e00._16_8_;
      uStack_548 = local_1e00._24_8_;
      local_580 = 0xb95e8083b95e8083;
      uStack_578 = 0xb95e8083b95e8083;
      uStack_570 = 0xb95e8083b95e8083;
      uStack_568 = 0xb95e8083b95e8083;
      local_5a0 = local_1dc0._0_8_;
      uStack_598 = local_1dc0._8_8_;
      uStack_590 = 0;
      uStack_588 = 0;
      auVar51._8_8_ = 0xb95e8083b95e8083;
      auVar51._0_8_ = 0xb95e8083b95e8083;
      auVar51._16_8_ = 0xb95e8083b95e8083;
      auVar51._24_8_ = 0xb95e8083b95e8083;
      auVar22 = vfnmadd213ps_fma(auVar51,local_1e00,ZEXT1632(auVar16));
      local_1dc0._0_8_ = auVar22._0_8_;
      local_9a0 = local_1dc0._0_8_;
      local_1dc0._8_8_ = auVar22._8_8_;
      uStack_998 = local_1dc0._8_8_;
      uStack_990 = 0;
      uStack_988 = 0;
      local_980._0_4_ = auVar22._0_4_;
      local_980._4_4_ = auVar22._4_4_;
      uStack_978._0_4_ = auVar22._8_4_;
      uStack_978._4_4_ = auVar22._12_4_;
      local_1de0._4_4_ = local_980._4_4_ * local_980._4_4_;
      local_1de0._0_4_ = (float)local_980 * (float)local_980;
      local_d60 = local_1de0;
      uStack_1dd8._0_4_ = (float)uStack_978 * (float)uStack_978;
      uStack_1dd8._4_4_ = uStack_978._4_4_ * uStack_978._4_4_;
      auVar17 = _local_1de0;
      _local_1de0 = ZEXT1632(_local_1de0);
      auVar40 = _local_1de0;
      uStack_1e78._0_4_ = 0x39506967;
      local_1e80 = (undefined1  [8])0x3950696739506967;
      uStack_1e78._4_4_ = 0x39506967;
      uStack_1e70._0_4_ = 0x39506967;
      uStack_1e70._4_4_ = 0x39506967;
      auVar70 = _local_1e80;
      uStack_1e68._0_4_ = 0x39506967;
      uStack_1e68._4_4_ = 0x39506967;
      auVar20 = _local_1e80;
      local_b60 = 0x3950696739506967;
      uStack_b58 = uStack_1e78;
      uStack_1e70 = auVar70._16_8_;
      uStack_b50 = uStack_1e70;
      uStack_1e68 = auVar20._24_8_;
      uStack_b48 = uStack_1e68;
      local_b80 = local_1dc0._0_8_;
      uStack_b78 = local_1dc0._8_8_;
      uStack_b70 = 0;
      uStack_b68 = 0;
      local_ba0 = 0x3ab743ce;
      uStack_b9c = 0x3ab743ce;
      uStack_b98 = 0x3ab743ce;
      uStack_b94 = 0x3ab743ce;
      uStack_b90 = 0x3ab743ce;
      uStack_b8c = 0x3ab743ce;
      uStack_b88 = 0x3ab743ce;
      uStack_b84 = 0x3ab743ce;
      local_800 = 0x3950696739506967;
      uStack_7f8 = uStack_1e78;
      uStack_7f0 = uStack_1e70;
      uStack_7e8 = uStack_1e68;
      local_820 = local_1dc0._0_8_;
      uStack_818 = local_1dc0._8_8_;
      uStack_810 = 0;
      uStack_808 = 0;
      local_840 = 0x3ab743ce3ab743ce;
      uStack_838 = 0x3ab743ce3ab743ce;
      uStack_830 = 0x3ab743ce3ab743ce;
      uStack_828 = 0x3ab743ce3ab743ce;
      auVar45._16_8_ = uStack_1e70;
      auVar45._0_16_ = _local_1e80;
      auVar45._24_8_ = uStack_1e68;
      auVar44._8_8_ = 0x3ab743ce3ab743ce;
      auVar44._0_8_ = 0x3ab743ce3ab743ce;
      auVar44._16_8_ = 0x3ab743ce3ab743ce;
      auVar44._24_8_ = 0x3ab743ce3ab743ce;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),auVar45,auVar44);
      local_1e80 = auVar16._0_8_;
      local_bc0 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uStack_bb8 = uStack_1e78;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_1dc0._0_8_;
      uStack_bd8 = local_1dc0._8_8_;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      local_c00 = 0x3c088908;
      uStack_bfc = 0x3c088908;
      uStack_bf8 = 0x3c088908;
      uStack_bf4 = 0x3c088908;
      uStack_bf0 = 0x3c088908;
      uStack_bec = 0x3c088908;
      uStack_be8 = 0x3c088908;
      uStack_be4 = 0x3c088908;
      local_7a0 = local_1e80;
      uStack_798 = uStack_1e78;
      uStack_790 = 0;
      uStack_788 = 0;
      local_7c0 = local_1dc0._0_8_;
      uStack_7b8 = local_1dc0._8_8_;
      uStack_7b0 = 0;
      uStack_7a8 = 0;
      local_7e0 = 0x3c0889083c088908;
      uStack_7d8 = 0x3c0889083c088908;
      uStack_7d0 = 0x3c0889083c088908;
      uStack_7c8 = 0x3c0889083c088908;
      auVar46._8_8_ = 0x3c0889083c088908;
      auVar46._0_8_ = 0x3c0889083c088908;
      auVar46._16_8_ = 0x3c0889083c088908;
      auVar46._24_8_ = 0x3c0889083c088908;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar46);
      local_1e80 = auVar16._0_8_;
      local_c20 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uStack_c18 = uStack_1e78;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = local_1dc0._0_8_;
      uStack_c38 = local_1dc0._8_8_;
      uStack_c30 = 0;
      uStack_c28 = 0;
      local_c60 = 0x3d2aa9c1;
      uStack_c5c = 0x3d2aa9c1;
      uStack_c58 = 0x3d2aa9c1;
      uStack_c54 = 0x3d2aa9c1;
      uStack_c50 = 0x3d2aa9c1;
      uStack_c4c = 0x3d2aa9c1;
      uStack_c48 = 0x3d2aa9c1;
      uStack_c44 = 0x3d2aa9c1;
      local_740 = local_1e80;
      uStack_738 = uStack_1e78;
      uStack_730 = 0;
      uStack_728 = 0;
      local_760 = local_1dc0._0_8_;
      uStack_758 = local_1dc0._8_8_;
      uStack_750 = 0;
      uStack_748 = 0;
      local_780 = 0x3d2aa9c13d2aa9c1;
      uStack_778 = 0x3d2aa9c13d2aa9c1;
      uStack_770 = 0x3d2aa9c13d2aa9c1;
      uStack_768 = 0x3d2aa9c13d2aa9c1;
      auVar47._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._16_8_ = 0x3d2aa9c13d2aa9c1;
      auVar47._24_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar47);
      local_1e80 = auVar16._0_8_;
      local_c80 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uStack_c78 = uStack_1e78;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_ca0 = local_1dc0._0_8_;
      uStack_c98 = local_1dc0._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0 = 0x3e2aaaaa;
      uStack_cbc = 0x3e2aaaaa;
      uStack_cb8 = 0x3e2aaaaa;
      uStack_cb4 = 0x3e2aaaaa;
      uStack_cb0 = 0x3e2aaaaa;
      uStack_cac = 0x3e2aaaaa;
      uStack_ca8 = 0x3e2aaaaa;
      uStack_ca4 = 0x3e2aaaaa;
      local_6e0 = local_1e80;
      uStack_6d8 = uStack_1e78;
      uStack_6d0 = 0;
      uStack_6c8 = 0;
      local_700 = local_1dc0._0_8_;
      uStack_6f8 = local_1dc0._8_8_;
      uStack_6f0 = 0;
      uStack_6e8 = 0;
      local_720 = 0x3e2aaaaa3e2aaaaa;
      uStack_718 = 0x3e2aaaaa3e2aaaaa;
      uStack_710 = 0x3e2aaaaa3e2aaaaa;
      uStack_708 = 0x3e2aaaaa3e2aaaaa;
      auVar48._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._16_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar48._24_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar48);
      local_1e80 = auVar16._0_8_;
      local_ce0 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uStack_cd8 = uStack_1e78;
      uStack_cd0 = 0;
      uStack_cc8 = 0;
      local_d00 = local_1dc0._0_8_;
      uStack_cf8 = local_1dc0._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20 = 0x3f000000;
      uStack_d1c = 0x3f000000;
      uStack_d18 = 0x3f000000;
      uStack_d14 = 0x3f000000;
      uStack_d10 = 0x3f000000;
      uStack_d0c = 0x3f000000;
      uStack_d08 = 0x3f000000;
      uStack_d04 = 0x3f000000;
      local_680 = local_1e80;
      uStack_678 = uStack_1e78;
      uStack_670 = 0;
      uStack_668 = 0;
      local_6a0 = local_1dc0._0_8_;
      uStack_698 = local_1dc0._8_8_;
      uStack_690 = 0;
      uStack_688 = 0;
      local_6c0 = 0x3f0000003f000000;
      uStack_6b8 = 0x3f0000003f000000;
      uStack_6b0 = 0x3f0000003f000000;
      uStack_6a8 = 0x3f0000003f000000;
      auVar49._8_8_ = 0x3f0000003f000000;
      auVar49._0_8_ = 0x3f0000003f000000;
      auVar49._16_8_ = 0x3f0000003f000000;
      auVar49._24_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar22),ZEXT1632(auVar16),auVar49);
      local_1e80 = auVar16._0_8_;
      local_d40 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uStack_d38 = uStack_1e78;
      uStack_d30 = 0;
      uStack_d28 = 0;
      uStack_1dd8 = auVar17._8_8_;
      uStack_d58 = uStack_1dd8;
      uStack_d50 = 0;
      uStack_d48 = 0;
      local_d80 = local_1dc0._0_8_;
      uStack_d78 = local_1dc0._8_8_;
      uStack_d70 = 0;
      uStack_d68 = 0;
      local_620 = local_1e80;
      uStack_618 = uStack_1e78;
      uStack_610 = 0;
      uStack_608 = 0;
      local_640 = local_d60;
      uStack_638 = uStack_1dd8;
      uStack_630 = 0;
      uStack_628 = 0;
      local_660 = local_1dc0._0_8_;
      uStack_658 = local_1dc0._8_8_;
      uStack_650 = 0;
      uStack_648 = 0;
      auVar16 = vfmadd213ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar16),ZEXT1632(auVar22));
      local_1e80 = auVar16._0_8_;
      uVar21 = local_1e80;
      uStack_1e78 = auVar16._8_8_;
      uVar23 = uStack_1e78;
      uStack_1d50 = 0;
      uStack_1d48 = 0;
      local_1d80 = 0x3f8000003f800000;
      uStack_1d78 = 0x3f8000003f800000;
      uStack_1d70 = 0x3f8000003f800000;
      uStack_1d68 = 0x3f8000003f800000;
      local_1d60._0_4_ = auVar16._0_4_;
      local_1d60._4_4_ = auVar16._4_4_;
      uStack_1d58._0_4_ = auVar16._8_4_;
      uStack_1d58._4_4_ = auVar16._12_4_;
      local_1e80._4_4_ = local_1d60._4_4_ + 1.0;
      local_1e80._0_4_ = (float)local_1d60 + 1.0;
      uStack_1e78._0_4_ = (float)uStack_1d58 + 1.0;
      uStack_1e78._4_4_ = uStack_1d58._4_4_ + 1.0;
      uStack_1e70._0_4_ = 0x3f800000;
      uStack_1e70._4_4_ = 0x3f800000;
      uStack_1e68._0_4_ = 0x3f800000;
      uStack_1e68._4_4_ = 0x3f800000;
      local_960._0_4_ = local_1e00._0_4_;
      local_960._4_4_ = local_1e00._4_4_;
      uStack_958._0_4_ = local_1e00._8_4_;
      uStack_958._4_4_ = local_1e00._12_4_;
      uStack_950._0_4_ = local_1e00._16_4_;
      uStack_950._4_4_ = local_1e00._20_4_;
      uStack_948._0_4_ = local_1e00._24_4_;
      uStack_948._4_4_ = local_1e00._28_4_;
      local_1e20._4_4_ = (int)local_960._4_4_;
      local_1e20._0_4_ = (int)(float)local_960;
      local_1e20._8_4_ = (int)(float)uStack_958;
      local_1e20._12_4_ = (int)uStack_958._4_4_;
      local_1e20._16_4_ = (int)(float)uStack_950;
      local_1e20._20_4_ = (int)uStack_950._4_4_;
      auVar70 = local_1e20._0_24_;
      local_1e20._24_4_ = (int)(float)uStack_948;
      local_1e20._28_4_ = (int)uStack_948._4_4_;
      auVar20 = local_1e20;
      local_920 = local_1e20._0_8_;
      uStack_918 = local_1e20._8_8_;
      local_1e20._16_8_ = auVar70._16_8_;
      uStack_910 = local_1e20._16_8_;
      local_1e20._24_8_ = auVar20._24_8_;
      uStack_908 = local_1e20._24_8_;
      local_940 = 0x7f0000007f;
      uStack_938 = 0x7f0000007f;
      uStack_930 = 0x7f0000007f;
      uStack_928 = 0x7f0000007f;
      local_520 = local_1e20._0_8_;
      uStack_518 = local_1e20._8_8_;
      uStack_510 = local_1e20._16_8_;
      uStack_508 = local_1e20._24_8_;
      local_540 = 0x7f0000007f;
      uStack_538 = 0x7f0000007f;
      uStack_530 = 0x7f0000007f;
      uStack_528 = 0x7f0000007f;
      auVar53._16_8_ = local_1e20._16_8_;
      auVar53._0_16_ = local_1e20._0_16_;
      auVar53._24_8_ = local_1e20._24_8_;
      auVar52._8_8_ = 0x7f0000007f;
      auVar52._0_8_ = 0x7f0000007f;
      auVar52._16_8_ = 0x7f0000007f;
      auVar52._24_8_ = 0x7f0000007f;
      auVar20 = vpaddd_avx2(auVar53,auVar52);
      local_1e20._0_8_ = auVar20._0_8_;
      local_8e0 = local_1e20._0_8_;
      local_1e20._8_8_ = auVar20._8_8_;
      uStack_8d8 = local_1e20._8_8_;
      local_1e20._16_8_ = auVar20._16_8_;
      uStack_8d0 = local_1e20._16_8_;
      local_1e20._24_8_ = auVar20._24_8_;
      uStack_8c8 = local_1e20._24_8_;
      local_8e4 = 0x17;
      local_4e0 = local_1e20._0_8_;
      uStack_4d8 = local_1e20._8_8_;
      uStack_4d0 = local_1e20._16_8_;
      uStack_4c8 = local_1e20._24_8_;
      local_4e4 = 0x17;
      local_1e20 = vpslld_avx2(auVar20,ZEXT416(0x17));
      local_8c0 = local_1e20._0_8_;
      uStack_8b8 = local_1e20._8_8_;
      uStack_8b0 = local_1e20._16_8_;
      uStack_8a8 = local_1e20._24_8_;
      local_1ea0 = local_1e20._0_8_;
      uStack_1e98 = local_1e20._8_8_;
      uStack_1e90 = local_1e20._16_8_;
      uStack_1e88 = local_1e20._24_8_;
      local_9c0 = _local_1e80;
      local_9e0._0_4_ = local_1e20._0_4_;
      local_9e0._4_4_ = local_1e20._4_4_;
      uStack_9d8._0_4_ = local_1e20._8_4_;
      uStack_9d8._4_4_ = local_1e20._12_4_;
      uStack_9d0._0_4_ = local_1e20._16_4_;
      uStack_9d0._4_4_ = local_1e20._20_4_;
      uStack_9c8._0_4_ = local_1e20._24_4_;
      local_1e80._0_4_ = ((float)local_1d60 + 1.0) * (float)local_9e0;
      local_1e80._4_4_ = (local_1d60._4_4_ + 1.0) * local_9e0._4_4_;
      uStack_9d8._0_4_ = ((float)uStack_1d58 + 1.0) * (float)uStack_9d8;
      uStack_9d8._4_4_ = (uStack_1d58._4_4_ + 1.0) * uStack_9d8._4_4_;
      uStack_1e78._0_4_ = (float)uStack_9d8;
      uStack_1e78._4_4_ = uStack_9d8._4_4_;
      uStack_1e70._0_4_ = (float)uStack_9d0 * 1.0;
      uStack_1e70._4_4_ = uStack_9d0._4_4_ * 1.0;
      auVar70 = _local_1e80;
      uStack_1e68._0_4_ = (float)uStack_9c8 * 1.0;
      uStack_1e68._4_4_ = 0x3f800000;
      auVar19 = _local_1e80;
      local_1ee0 = local_1e80;
      uStack_1ed8 = uStack_1e78;
      uStack_1e70 = auVar70._16_8_;
      uStack_1ed0 = uStack_1e70;
      uStack_1e68 = auVar19._24_8_;
      uStack_1ec8 = uStack_1e68;
      local_1ec0._0_4_ = local_e40._0_4_;
      local_1ec0._4_4_ = local_e40._4_4_;
      uStack_1eb8._0_4_ = local_e40._8_4_;
      uStack_1eb8._4_4_ = local_e40._12_4_;
      uStack_1eb0._0_4_ = auStack_e30._0_4_;
      uStack_1eb0._4_4_ = auStack_e30._4_4_;
      uStack_1ea8._0_4_ = auStack_e30._8_4_;
      uStack_1ea8._4_4_ = auStack_e30._12_4_;
      local_1f20 = (float)local_1ec0 + (float)local_1e80._0_4_;
      fStack_1f1c = local_1ec0._4_4_ + (float)local_1e80._4_4_;
      fStack_1f18 = (float)uStack_1eb8 + (float)uStack_9d8;
      fStack_1f14 = uStack_1eb8._4_4_ + uStack_9d8._4_4_;
      fStack_1f10 = (float)uStack_1eb0 + (float)uStack_9d0 * 1.0;
      fStack_1f0c = uStack_1eb0._4_4_ + uStack_9d0._4_4_ * 1.0;
      fStack_1f08 = (float)uStack_1ea8 + (float)uStack_9c8 * 1.0;
      fStack_1f04 = uStack_1ea8._4_4_ + 1.0;
      auVar18._16_8_ = auStack_e30._0_8_;
      auVar18._0_16_ = local_e40;
      auVar18._24_8_ = auStack_e30._8_8_;
      auVar20._4_4_ = fStack_1f1c;
      auVar20._0_4_ = local_1f20;
      auVar20._8_4_ = fStack_1f18;
      auVar20._12_4_ = fStack_1f14;
      auVar20._16_4_ = fStack_1f10;
      auVar20._20_4_ = fStack_1f0c;
      auVar20._24_4_ = fStack_1f08;
      auVar20._28_4_ = fStack_1f04;
      auVar20 = vdivps_avx(auVar18,auVar20);
      local_1c88 = local_2578;
      local_2720 = auVar20._0_8_;
      local_1cc0 = local_2720;
      uStack_2718 = auVar20._8_8_;
      uStack_1cb8 = uStack_2718;
      uStack_2710 = auVar20._16_8_;
      uStack_1cb0 = uStack_2710;
      uStack_2708 = auVar20._24_8_;
      uStack_1ca8 = uStack_2708;
      *(undefined8 *)*local_2578 = local_2720;
      *(undefined8 *)(*local_2578 + 8) = uStack_2718;
      *(undefined8 *)(*local_2578 + 0x10) = uStack_2710;
      *(undefined8 *)(*local_2578 + 0x18) = uStack_2708;
      local_2578 = (undefined1 (*) [64])(*local_2578 + 0x20);
      local_1ec0 = local_1f00;
      uStack_1eb8 = uStack_1ef8;
      uStack_1eb0 = uStack_1ef0;
      uStack_1ea8 = uStack_1ee8;
      _local_1e80 = auVar19;
      _local_1de0 = auVar40;
      local_1dc0 = ZEXT1632(auVar22);
      local_1d60 = uVar21;
      uStack_1d58 = uVar23;
      local_9e0 = local_1e20._0_8_;
      uStack_9d8 = local_1e20._8_8_;
      uStack_9d0 = local_1e20._16_8_;
      uStack_9c8 = local_1e20._24_8_;
      local_980 = local_9a0;
      uStack_978 = uStack_998;
      uStack_970 = uStack_990;
      uStack_968 = uStack_988;
      local_960 = local_1e00._0_8_;
      uStack_958 = local_1e00._8_8_;
      uStack_950 = local_1e00._16_8_;
      uStack_948 = local_1e00._24_8_;
    }
    local_1c64 = 0x3f800000;
    local_1c80 = 0x3f800000;
    uStack_1c7c = 0x3f800000;
    uStack_1c78 = 0x3f800000;
    uStack_1c74 = 0x3f800000;
    local_1c60 = (undefined1  [16])0x0;
    for (; local_1a70 = local_2510, local_25a0 = local_1ad0, local_25d0 + 3 < local_2568;
        local_25d0 = local_25d0 + 4) {
      local_1c48 = local_2578;
      local_1b10 = *(undefined8 *)*local_2578;
      uStack_1b08 = *(undefined8 *)(*local_2578 + 8);
      local_1b00 = 0;
      uStack_1af8 = 0;
      auVar16 = vsubps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_2578);
      local_1b80 = (undefined1  [16])0x0;
      local_1bd0 = 0x3f800000;
      uStack_1bcc = 0x3f800000;
      uStack_1bc8 = 0x3f800000;
      uStack_1bc4 = 0x3f800000;
      local_1b90._0_8_ = auVar16._0_8_;
      local_4a0 = local_1b90._0_8_;
      local_1b90._8_8_ = auVar16._8_8_;
      uStack_498 = local_1b90._8_8_;
      local_4b0 = 0x42b0c0a5;
      uStack_4ac = 0x42b0c0a5;
      uStack_4a8 = 0x42b0c0a5;
      uStack_4a4 = 0x42b0c0a5;
      auVar17._8_4_ = 0x42b0c0a5;
      auVar17._0_8_ = 0x42b0c0a542b0c0a5;
      auVar17._12_4_ = 0x42b0c0a5;
      auVar16 = vminps_avx(auVar16,auVar17);
      local_1b90._0_8_ = auVar16._0_8_;
      local_480 = local_1b90._0_8_;
      local_1b90._8_8_ = auVar16._8_8_;
      uStack_478 = local_1b90._8_8_;
      local_490 = 0xc2b0c0a5;
      uStack_48c = 0xc2b0c0a5;
      uStack_488 = 0xc2b0c0a5;
      uStack_484 = 0xc2b0c0a5;
      auVar54._8_4_ = 0xc2b0c0a5;
      auVar54._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar54._12_4_ = 0xc2b0c0a5;
      auVar17 = vmaxps_avx(auVar16,auVar54);
      local_1b90._0_8_ = auVar17._0_8_;
      uVar21 = local_1b90._0_8_;
      local_1b90._8_8_ = auVar17._8_8_;
      uVar23 = local_1b90._8_8_;
      local_430 = 0x3fb8aa3b;
      uStack_42c = 0x3fb8aa3b;
      uStack_428 = 0x3fb8aa3b;
      uStack_424 = 0x3fb8aa3b;
      local_420._0_4_ = auVar17._0_4_;
      local_420._4_4_ = auVar17._4_4_;
      uStack_418._0_4_ = auVar17._8_4_;
      uStack_418._4_4_ = auVar17._12_4_;
      local_1bb0._4_4_ = local_420._4_4_ * 1.442695;
      local_1bb0._0_4_ = (float)local_420 * 1.442695;
      uStack_1ba8._0_4_ = (float)uStack_418 * 1.442695;
      uStack_1ba8._4_4_ = uStack_418._4_4_ * 1.442695;
      local_1b40 = local_1bb0;
      uStack_1b38 = uStack_1ba8;
      local_1b50 = 0x3f000000;
      uStack_1b4c = 0x3f000000;
      uStack_1b48 = 0x3f000000;
      uStack_1b44 = 0x3f000000;
      local_1bb0._0_4_ = (float)local_420 * 1.442695 + 0.5;
      local_1bb0._4_4_ = local_420._4_4_ * 1.442695 + 0.5;
      fVar77 = (float)uStack_418 * 1.442695 + 0.5;
      fVar78 = uStack_418._4_4_ * 1.442695 + 0.5;
      uStack_1ba8._0_4_ = fVar77;
      uStack_1ba8._4_4_ = fVar78;
      local_400 = local_1bb0;
      uStack_3f8 = uStack_1ba8;
      local_1bc0._4_4_ = (int)(float)local_1bb0._4_4_;
      local_1bc0._0_4_ = (int)(float)local_1bb0._0_4_;
      local_1bc0._8_4_ = (int)fVar77;
      local_1bc0._12_4_ = (int)fVar78;
      local_3f0 = local_1bc0._0_8_;
      uStack_3e8 = local_1bc0._8_8_;
      auVar55._8_8_ = local_1bc0._8_8_;
      auVar55._0_8_ = local_1bc0._0_8_;
      auVar22 = vcvtdq2ps_avx(auVar55);
      local_1ba0 = auVar22._0_8_;
      local_3d0 = local_1ba0;
      uStack_1b98 = auVar22._8_8_;
      uStack_3c8 = uStack_1b98;
      local_3e0 = local_1bb0;
      uStack_3d8 = uStack_1ba8;
      auVar56._8_8_ = uStack_1ba8;
      auVar56._0_8_ = local_1bb0;
      auVar16 = vcmpps_avx(auVar56,auVar22,1);
      local_1be0._0_8_ = auVar16._0_8_;
      local_3b0 = local_1be0._0_8_;
      local_1be0._8_8_ = auVar16._8_8_;
      uStack_3a8 = local_1be0._8_8_;
      local_3c0 = 0x3f8000003f800000;
      uStack_3b8 = 0x3f8000003f800000;
      auVar57._8_8_ = 0x3f8000003f800000;
      auVar57._0_8_ = 0x3f8000003f800000;
      local_1be0 = vpand_avx(auVar16,auVar57);
      local_1b20 = local_1ba0;
      uStack_1b18 = uStack_1b98;
      local_1b30 = local_1be0._0_8_;
      uStack_1b28 = local_1be0._8_8_;
      _local_1bb0 = vsubps_avx(auVar22,local_1be0);
      local_350 = local_1bb0;
      uStack_348 = uStack_1ba8;
      local_370 = local_1b90._0_8_;
      uStack_368 = local_1b90._8_8_;
      local_360 = 0x3f318000;
      uStack_35c = 0x3f318000;
      uStack_358 = 0x3f318000;
      uStack_354 = 0x3f318000;
      local_1b0 = local_1bb0;
      uStack_1a8 = uStack_1ba8;
      local_1c0 = 0x3f3180003f318000;
      uStack_1b8 = 0x3f3180003f318000;
      local_1d0 = local_1b90._0_8_;
      uStack_1c8 = local_1b90._8_8_;
      auVar60._8_8_ = 0x3f3180003f318000;
      auVar60._0_8_ = 0x3f3180003f318000;
      auVar16 = vfnmadd213ps_fma(auVar60,_local_1bb0,auVar17);
      local_380 = local_1bb0;
      uStack_378 = uStack_1ba8;
      local_1b90._0_8_ = auVar16._0_8_;
      local_3a0 = local_1b90._0_8_;
      local_1b90._8_8_ = auVar16._8_8_;
      uStack_398 = local_1b90._8_8_;
      local_390 = 0xb95e8083;
      uStack_38c = 0xb95e8083;
      uStack_388 = 0xb95e8083;
      uStack_384 = 0xb95e8083;
      local_180 = local_1bb0;
      uStack_178 = uStack_1ba8;
      local_190 = 0xb95e8083b95e8083;
      uStack_188 = 0xb95e8083b95e8083;
      local_1a0 = local_1b90._0_8_;
      uStack_198 = local_1b90._8_8_;
      auVar61._8_8_ = 0xb95e8083b95e8083;
      auVar61._0_8_ = 0xb95e8083b95e8083;
      local_1b90 = vfnmadd213ps_fma(auVar61,_local_1bb0,auVar16);
      local_450 = local_1b90._0_8_;
      uStack_448 = local_1b90._8_8_;
      local_440._0_4_ = local_1b90._0_4_;
      local_440._4_4_ = local_1b90._4_4_;
      uStack_438._0_4_ = local_1b90._8_4_;
      uStack_438._4_4_ = local_1b90._12_4_;
      local_1ba0 = CONCAT44(local_440._4_4_ * local_440._4_4_,(float)local_440 * (float)local_440);
      uStack_1b98._0_4_ = (float)uStack_438 * (float)uStack_438;
      uStack_1b98._4_4_ = uStack_438._4_4_ * uStack_438._4_4_;
      uStack_1be8._0_4_ = 0x39506967;
      local_1bf0 = (undefined1  [8])0x3950696739506967;
      uStack_1be8._4_4_ = 0x39506967;
      local_230 = 0x3950696739506967;
      uStack_228 = uStack_1be8;
      local_240 = local_1b90._0_8_;
      uStack_238 = local_1b90._8_8_;
      local_250 = 0x3ab743ce;
      uStack_24c = 0x3ab743ce;
      uStack_248 = 0x3ab743ce;
      uStack_244 = 0x3ab743ce;
      local_150 = 0x3950696739506967;
      uStack_148 = uStack_1be8;
      local_160 = local_1b90._0_8_;
      uStack_158 = local_1b90._8_8_;
      local_170 = 0x3ab743ce3ab743ce;
      uStack_168 = 0x3ab743ce3ab743ce;
      auVar63._8_8_ = uStack_1be8;
      auVar63._0_8_ = 0x3950696739506967;
      auVar62._8_8_ = 0x3ab743ce3ab743ce;
      auVar62._0_8_ = 0x3ab743ce3ab743ce;
      auVar16 = vfmadd213ps_fma(local_1b90,auVar63,auVar62);
      local_1bf0 = auVar16._0_8_;
      local_260 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uStack_258 = uStack_1be8;
      local_270 = local_1b90._0_8_;
      uStack_268 = local_1b90._8_8_;
      local_280 = 0x3c088908;
      uStack_27c = 0x3c088908;
      uStack_278 = 0x3c088908;
      uStack_274 = 0x3c088908;
      local_120 = local_1bf0;
      uStack_118 = uStack_1be8;
      local_130 = local_1b90._0_8_;
      uStack_128 = local_1b90._8_8_;
      local_140 = 0x3c0889083c088908;
      uStack_138 = 0x3c0889083c088908;
      auVar64._8_8_ = 0x3c0889083c088908;
      auVar64._0_8_ = 0x3c0889083c088908;
      auVar16 = vfmadd213ps_fma(local_1b90,auVar16,auVar64);
      local_1bf0 = auVar16._0_8_;
      local_290 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uStack_288 = uStack_1be8;
      local_2a0 = local_1b90._0_8_;
      uStack_298 = local_1b90._8_8_;
      local_2b0 = 0x3d2aa9c1;
      uStack_2ac = 0x3d2aa9c1;
      uStack_2a8 = 0x3d2aa9c1;
      uStack_2a4 = 0x3d2aa9c1;
      local_f0 = local_1bf0;
      uStack_e8 = uStack_1be8;
      local_100 = local_1b90._0_8_;
      uStack_f8 = local_1b90._8_8_;
      local_110 = 0x3d2aa9c13d2aa9c1;
      uStack_108 = 0x3d2aa9c13d2aa9c1;
      auVar65._8_8_ = 0x3d2aa9c13d2aa9c1;
      auVar65._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar16 = vfmadd213ps_fma(local_1b90,auVar16,auVar65);
      local_1bf0 = auVar16._0_8_;
      local_2c0 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uStack_2b8 = uStack_1be8;
      local_2d0 = local_1b90._0_8_;
      uStack_2c8 = local_1b90._8_8_;
      local_2e0 = 0x3e2aaaaa;
      uStack_2dc = 0x3e2aaaaa;
      uStack_2d8 = 0x3e2aaaaa;
      uStack_2d4 = 0x3e2aaaaa;
      local_c0 = local_1bf0;
      uStack_b8 = uStack_1be8;
      local_d0 = local_1b90._0_8_;
      uStack_c8 = local_1b90._8_8_;
      local_e0 = 0x3e2aaaaa3e2aaaaa;
      uStack_d8 = 0x3e2aaaaa3e2aaaaa;
      auVar66._8_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar66._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar16 = vfmadd213ps_fma(local_1b90,auVar16,auVar66);
      local_1bf0 = auVar16._0_8_;
      local_2f0 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uStack_2e8 = uStack_1be8;
      local_300 = local_1b90._0_8_;
      uStack_2f8 = local_1b90._8_8_;
      local_310 = 0x3f000000;
      uStack_30c = 0x3f000000;
      uStack_308 = 0x3f000000;
      uStack_304 = 0x3f000000;
      local_90 = local_1bf0;
      uStack_88 = uStack_1be8;
      local_a0 = local_1b90._0_8_;
      uStack_98 = local_1b90._8_8_;
      local_b0 = 0x3f0000003f000000;
      uStack_a8 = 0x3f0000003f000000;
      auVar67._8_8_ = 0x3f0000003f000000;
      auVar67._0_8_ = 0x3f0000003f000000;
      auVar16 = vfmadd213ps_fma(local_1b90,auVar16,auVar67);
      local_1bf0 = auVar16._0_8_;
      local_320 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uStack_318 = uStack_1be8;
      local_330 = local_1ba0;
      uStack_328 = uStack_1b98;
      local_340 = local_1b90._0_8_;
      uStack_338 = local_1b90._8_8_;
      local_60 = local_1bf0;
      uStack_58 = uStack_1be8;
      local_70 = local_1ba0;
      uStack_68 = uStack_1b98;
      local_80 = local_1b90._0_8_;
      uStack_78 = local_1b90._8_8_;
      auVar68._8_8_ = uStack_1b98;
      auVar68._0_8_ = local_1ba0;
      auVar16 = vfmadd213ps_fma(auVar68,auVar16,local_1b90);
      local_1bf0 = auVar16._0_8_;
      uVar24 = local_1bf0;
      uStack_1be8 = auVar16._8_8_;
      uVar25 = uStack_1be8;
      local_1b70 = 0x3f8000003f800000;
      uStack_1b68 = 0x3f8000003f800000;
      local_1b60._0_4_ = auVar16._0_4_;
      local_1b60._4_4_ = auVar16._4_4_;
      uStack_1b58._0_4_ = auVar16._8_4_;
      uStack_1b58._4_4_ = auVar16._12_4_;
      local_1bf0._4_4_ = local_1b60._4_4_ + 1.0;
      local_1bf0._0_4_ = (float)local_1b60 + 1.0;
      uStack_1be8._0_4_ = (float)uStack_1b58 + 1.0;
      uStack_1be8._4_4_ = uStack_1b58._4_4_ + 1.0;
      local_410._0_4_ = local_1bb0._0_4_;
      local_410._4_4_ = local_1bb0._4_4_;
      uStack_408._0_4_ = local_1bb0._8_4_;
      uStack_408._4_4_ = local_1bb0._12_4_;
      local_1bc0._4_4_ = (int)local_410._4_4_;
      local_1bc0._0_4_ = (int)(float)local_410;
      local_1bc0._8_4_ = (int)(float)uStack_408;
      local_1bc0._12_4_ = (int)uStack_408._4_4_;
      local_210 = local_1bc0._0_8_;
      uStack_208 = local_1bc0._8_8_;
      local_220 = 0x7f0000007f;
      uStack_218 = 0x7f0000007f;
      auVar59._8_8_ = local_1bc0._8_8_;
      auVar59._0_8_ = local_1bc0._0_8_;
      auVar58._8_8_ = 0x7f0000007f;
      auVar58._0_8_ = 0x7f0000007f;
      auVar16 = vpaddd_avx(auVar59,auVar58);
      local_1bc0._0_8_ = auVar16._0_8_;
      local_1f0 = local_1bc0._0_8_;
      local_1bc0._8_8_ = auVar16._8_8_;
      uStack_1e8 = local_1bc0._8_8_;
      local_1f4 = 0x17;
      local_1bc0 = vpslld_avx(auVar16,ZEXT416(0x17));
      local_1e0 = local_1bc0._0_8_;
      uStack_1d8 = local_1bc0._8_8_;
      local_1c00 = local_1bc0._0_8_;
      uStack_1bf8 = local_1bc0._8_8_;
      local_460 = _local_1bf0;
      local_470._0_4_ = local_1bc0._0_4_;
      local_470._4_4_ = local_1bc0._4_4_;
      uStack_468._0_4_ = local_1bc0._8_4_;
      uStack_468._4_4_ = local_1bc0._12_4_;
      local_1bf0._0_4_ = ((float)local_1b60 + 1.0) * (float)local_470;
      local_1bf0._4_4_ = (local_1b60._4_4_ + 1.0) * local_470._4_4_;
      uStack_468._0_4_ = ((float)uStack_1b58 + 1.0) * (float)uStack_468;
      uStack_468._4_4_ = (uStack_1b58._4_4_ + 1.0) * uStack_468._4_4_;
      uStack_1be8._0_4_ = (float)uStack_468;
      uStack_1be8._4_4_ = uStack_468._4_4_;
      local_1c20 = local_1bf0;
      uStack_1c18 = uStack_1be8;
      local_1c40 = (float)local_1bf0._0_4_ + 1.0;
      fStack_1c3c = (float)local_1bf0._4_4_ + 1.0;
      fStack_1c38 = (float)uStack_468 + 1.0;
      fStack_1c34 = uStack_468._4_4_ + 1.0;
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar16._4_4_ = fStack_1c3c;
      auVar16._0_4_ = local_1c40;
      auVar16._8_4_ = fStack_1c38;
      auVar16._12_4_ = fStack_1c34;
      auVar16 = vdivps_avx(auVar22,auVar16);
      local_1ad8 = local_2578;
      local_2750 = auVar16._0_8_;
      local_1af0 = local_2750;
      uStack_2748 = auVar16._8_8_;
      uStack_1ae8 = uStack_2748;
      *(undefined8 *)*local_2578 = local_2750;
      *(undefined8 *)(*local_2578 + 8) = uStack_2748;
      local_2578 = (undefined1 (*) [64])(*local_2578 + 0x10);
      local_1c30 = 0x3f8000003f800000;
      uStack_1c28 = 0x3f8000003f800000;
      local_1c10 = 0x3f8000003f800000;
      uStack_1c08 = 0x3f8000003f800000;
      local_1b60 = uVar24;
      uStack_1b58 = uVar25;
      local_470 = local_1bc0._0_8_;
      uStack_468 = local_1bc0._8_8_;
      local_440 = local_450;
      uStack_438 = uStack_448;
      local_420 = uVar21;
      uStack_418 = uVar23;
      local_410 = local_1bb0;
      uStack_408 = uStack_1ba8;
    }
    for (; local_25d0 < local_2568; local_25d0 = local_25d0 + 1) {
      dVar76 = std::exp((double)(ulong)(*(uint *)*local_2578 ^ 0x80000000));
      *(float *)*local_2578 = 1.0 / (SUB84(dVar76,0) + 1.0);
      local_2578 = (undefined1 (*) [64])(*local_2578 + 4);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}